

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiIntersectorK<8,4>::
     occluded_t<embree::avx512::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,4,8>,embree::avx512::Occluded1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  Primitive PVar11;
  int iVar12;
  Geometry *pGVar13;
  RTCFilterFunctionN p_Var14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  undefined1 auVar22 [16];
  undefined8 uVar23;
  long lVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [16];
  RayK<4> *pRVar79;
  byte bVar80;
  ulong uVar81;
  bool bVar82;
  ulong uVar83;
  uint uVar84;
  ulong uVar85;
  Geometry *geometry;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  long lVar86;
  ulong uVar87;
  float fVar88;
  float fVar89;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  float fVar136;
  float fVar137;
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar93 [16];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar94 [16];
  float fVar138;
  float fVar140;
  float fVar141;
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  float fVar139;
  float fVar142;
  float fVar143;
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  float fVar144;
  undefined4 uVar145;
  undefined8 uVar146;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [16];
  undefined1 auVar153 [64];
  float fVar154;
  float fVar155;
  float fVar164;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  float fVar165;
  float fVar170;
  float fVar171;
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [32];
  undefined1 auVar175 [64];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [16];
  undefined1 auVar180 [32];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [64];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [64];
  undefined1 auVar192 [64];
  undefined1 in_ZMM20 [64];
  undefined1 auVar193 [64];
  undefined1 auVar194 [64];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CatmullRomCurveT<embree::Vec3fx>,_8> bhit;
  bool local_6f9;
  undefined8 local_680;
  undefined8 uStack_678;
  ulong local_668;
  RTCFilterFunctionNArguments local_660;
  undefined1 local_630 [16];
  undefined8 local_620;
  undefined8 uStack_618;
  undefined4 local_610;
  undefined4 uStack_60c;
  undefined8 uStack_608;
  undefined1 local_600 [16];
  undefined1 local_5f0 [16];
  undefined1 local_5e0 [16];
  undefined1 local_5d0 [16];
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined1 local_5a0 [32];
  undefined8 local_580;
  undefined8 uStack_578;
  LinearSpace3fa *local_568;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_490 [16];
  float local_480;
  float fStack_47c;
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined4 local_450;
  undefined4 uStack_44c;
  undefined4 uStack_448;
  undefined4 uStack_444;
  undefined1 local_440 [16];
  undefined1 local_430 [16];
  undefined1 local_420 [16];
  undefined4 local_410;
  undefined4 uStack_40c;
  undefined4 uStack_408;
  undefined4 uStack_404;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined1 local_3f0 [16];
  uint local_3e0;
  uint uStack_3dc;
  uint uStack_3d8;
  uint uStack_3d4;
  uint uStack_3d0;
  uint uStack_3cc;
  uint uStack_3c8;
  uint uStack_3c4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined4 local_360;
  int local_35c;
  undefined1 local_350 [16];
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  byte local_310;
  float local_300 [4];
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  uint local_280;
  uint uStack_27c;
  uint uStack_278;
  uint uStack_274;
  uint uStack_270;
  uint uStack_26c;
  uint uStack_268;
  uint uStack_264;
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [8];
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  undefined4 uStack_164;
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar11 = prim[1];
  uVar87 = (ulong)(byte)PVar11;
  fVar165 = *(float *)(prim + uVar87 * 0x19 + 0x12);
  auVar22 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar22 = vinsertps_avx(auVar22,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar92 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar152 = vinsertps_avx(auVar92,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar93 = vsubps_avx(auVar22,*(undefined1 (*) [16])(prim + uVar87 * 0x19 + 6));
  fVar154 = fVar165 * auVar93._0_4_;
  fVar144 = fVar165 * auVar152._0_4_;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar87 * 4 + 6);
  auVar103 = vpmovsxbd_avx2(auVar22);
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar92._8_8_ = 0;
  auVar92._0_8_ = *(ulong *)(prim + uVar87 * 5 + 6);
  auVar101 = vpmovsxbd_avx2(auVar92);
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar91._8_8_ = 0;
  auVar91._0_8_ = *(ulong *)(prim + uVar87 * 6 + 6);
  auVar102 = vpmovsxbd_avx2(auVar91);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar196._8_8_ = 0;
  auVar196._0_8_ = *(ulong *)(prim + uVar87 * 0xb + 6);
  auVar116 = vpmovsxbd_avx2(auVar196);
  auVar116 = vcvtdq2ps_avx(auVar116);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar11 * 0xc) + 6);
  auVar115 = vpmovsxbd_avx2(auVar8);
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar195._8_8_ = 0;
  auVar195._0_8_ = *(ulong *)(prim + (uint)(byte)PVar11 * 0xc + uVar87 + 6);
  auVar114 = vpmovsxbd_avx2(auVar195);
  auVar114 = vcvtdq2ps_avx(auVar114);
  uVar85 = (ulong)(uint)((int)(uVar87 * 9) * 2);
  auVar90._8_8_ = 0;
  auVar90._0_8_ = *(ulong *)(prim + uVar85 + 6);
  auVar104 = vpmovsxbd_avx2(auVar90);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar85 + uVar87 + 6);
  auVar113 = vpmovsxbd_avx2(auVar9);
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar105 = vcvtdq2ps_avx(auVar113);
  uVar83 = (ulong)(uint)((int)(uVar87 * 5) << 2);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar83 + 6);
  auVar99 = vpmovsxbd_avx2(auVar10);
  auVar106 = vcvtdq2ps_avx(auVar99);
  auVar185._4_4_ = fVar144;
  auVar185._0_4_ = fVar144;
  auVar185._8_4_ = fVar144;
  auVar185._12_4_ = fVar144;
  auVar185._16_4_ = fVar144;
  auVar185._20_4_ = fVar144;
  auVar185._24_4_ = fVar144;
  auVar185._28_4_ = fVar144;
  auVar188._8_4_ = 1;
  auVar188._0_8_ = 0x100000001;
  auVar188._12_4_ = 1;
  auVar188._16_4_ = 1;
  auVar188._20_4_ = 1;
  auVar188._24_4_ = 1;
  auVar188._28_4_ = 1;
  auVar107 = ZEXT1632(CONCAT412(fVar165 * auVar152._12_4_,
                                CONCAT48(fVar165 * auVar152._8_4_,
                                         CONCAT44(fVar165 * auVar152._4_4_,fVar144))));
  auVar100 = vpermps_avx2(auVar188,auVar107);
  auVar97 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar98 = vpermps_avx512vl(auVar97,auVar107);
  fVar144 = auVar98._0_4_;
  fVar170 = auVar98._4_4_;
  auVar107._4_4_ = fVar170 * auVar102._4_4_;
  auVar107._0_4_ = fVar144 * auVar102._0_4_;
  fVar171 = auVar98._8_4_;
  auVar107._8_4_ = fVar171 * auVar102._8_4_;
  fVar155 = auVar98._12_4_;
  auVar107._12_4_ = fVar155 * auVar102._12_4_;
  fVar164 = auVar98._16_4_;
  auVar107._16_4_ = fVar164 * auVar102._16_4_;
  fVar88 = auVar98._20_4_;
  auVar107._20_4_ = fVar88 * auVar102._20_4_;
  fVar89 = auVar98._24_4_;
  auVar107._24_4_ = fVar89 * auVar102._24_4_;
  auVar107._28_4_ = auVar113._28_4_;
  auVar113._4_4_ = auVar114._4_4_ * fVar170;
  auVar113._0_4_ = auVar114._0_4_ * fVar144;
  auVar113._8_4_ = auVar114._8_4_ * fVar171;
  auVar113._12_4_ = auVar114._12_4_ * fVar155;
  auVar113._16_4_ = auVar114._16_4_ * fVar164;
  auVar113._20_4_ = auVar114._20_4_ * fVar88;
  auVar113._24_4_ = auVar114._24_4_ * fVar89;
  auVar113._28_4_ = auVar99._28_4_;
  auVar99._4_4_ = auVar106._4_4_ * fVar170;
  auVar99._0_4_ = auVar106._0_4_ * fVar144;
  auVar99._8_4_ = auVar106._8_4_ * fVar171;
  auVar99._12_4_ = auVar106._12_4_ * fVar155;
  auVar99._16_4_ = auVar106._16_4_ * fVar164;
  auVar99._20_4_ = auVar106._20_4_ * fVar88;
  auVar99._24_4_ = auVar106._24_4_ * fVar89;
  auVar99._28_4_ = auVar98._28_4_;
  auVar22 = vfmadd231ps_fma(auVar107,auVar100,auVar101);
  auVar92 = vfmadd231ps_fma(auVar113,auVar100,auVar115);
  auVar91 = vfmadd231ps_fma(auVar99,auVar105,auVar100);
  auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar185,auVar103);
  auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar185,auVar116);
  auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar104,auVar185);
  auVar186._4_4_ = fVar154;
  auVar186._0_4_ = fVar154;
  auVar186._8_4_ = fVar154;
  auVar186._12_4_ = fVar154;
  auVar186._16_4_ = fVar154;
  auVar186._20_4_ = fVar154;
  auVar186._24_4_ = fVar154;
  auVar186._28_4_ = fVar154;
  auVar99 = ZEXT1632(CONCAT412(fVar165 * auVar93._12_4_,
                               CONCAT48(fVar165 * auVar93._8_4_,
                                        CONCAT44(fVar165 * auVar93._4_4_,fVar154))));
  auVar113 = vpermps_avx2(auVar188,auVar99);
  auVar99 = vpermps_avx512vl(auVar97,auVar99);
  auVar100 = vmulps_avx512vl(auVar99,auVar102);
  auVar109._0_4_ = auVar99._0_4_ * auVar114._0_4_;
  auVar109._4_4_ = auVar99._4_4_ * auVar114._4_4_;
  auVar109._8_4_ = auVar99._8_4_ * auVar114._8_4_;
  auVar109._12_4_ = auVar99._12_4_ * auVar114._12_4_;
  auVar109._16_4_ = auVar99._16_4_ * auVar114._16_4_;
  auVar109._20_4_ = auVar99._20_4_ * auVar114._20_4_;
  auVar109._24_4_ = auVar99._24_4_ * auVar114._24_4_;
  auVar109._28_4_ = 0;
  auVar114._4_4_ = auVar99._4_4_ * auVar106._4_4_;
  auVar114._0_4_ = auVar99._0_4_ * auVar106._0_4_;
  auVar114._8_4_ = auVar99._8_4_ * auVar106._8_4_;
  auVar114._12_4_ = auVar99._12_4_ * auVar106._12_4_;
  auVar114._16_4_ = auVar99._16_4_ * auVar106._16_4_;
  auVar114._20_4_ = auVar99._20_4_ * auVar106._20_4_;
  auVar114._24_4_ = auVar99._24_4_ * auVar106._24_4_;
  auVar114._28_4_ = auVar102._28_4_;
  auVar101 = vfmadd231ps_avx512vl(auVar100,auVar113,auVar101);
  auVar196 = vfmadd231ps_fma(auVar109,auVar113,auVar115);
  auVar8 = vfmadd231ps_fma(auVar114,auVar113,auVar105);
  auVar101 = vfmadd231ps_avx512vl(auVar101,auVar186,auVar103);
  auVar196 = vfmadd231ps_fma(ZEXT1632(auVar196),auVar186,auVar116);
  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar186,auVar104);
  auVar177._8_4_ = 0x7fffffff;
  auVar177._0_8_ = 0x7fffffff7fffffff;
  auVar177._12_4_ = 0x7fffffff;
  auVar177._16_4_ = 0x7fffffff;
  auVar177._20_4_ = 0x7fffffff;
  auVar177._24_4_ = 0x7fffffff;
  auVar177._28_4_ = 0x7fffffff;
  auVar103 = vandps_avx(ZEXT1632(auVar22),auVar177);
  auVar111._8_4_ = 0x219392ef;
  auVar111._0_8_ = 0x219392ef219392ef;
  auVar111._12_4_ = 0x219392ef;
  auVar111._16_4_ = 0x219392ef;
  auVar111._20_4_ = 0x219392ef;
  auVar111._24_4_ = 0x219392ef;
  auVar111._28_4_ = 0x219392ef;
  uVar85 = vcmpps_avx512vl(auVar103,auVar111,1);
  bVar82 = (bool)((byte)uVar85 & 1);
  auVar100._0_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar22._0_4_;
  bVar82 = (bool)((byte)(uVar85 >> 1) & 1);
  auVar100._4_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar22._4_4_;
  bVar82 = (bool)((byte)(uVar85 >> 2) & 1);
  auVar100._8_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar22._8_4_;
  bVar82 = (bool)((byte)(uVar85 >> 3) & 1);
  auVar100._12_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar22._12_4_;
  auVar100._16_4_ = (uint)((byte)(uVar85 >> 4) & 1) * 0x219392ef;
  auVar100._20_4_ = (uint)((byte)(uVar85 >> 5) & 1) * 0x219392ef;
  auVar100._24_4_ = (uint)((byte)(uVar85 >> 6) & 1) * 0x219392ef;
  auVar100._28_4_ = (uint)(byte)(uVar85 >> 7) * 0x219392ef;
  auVar103 = vandps_avx(ZEXT1632(auVar92),auVar177);
  uVar85 = vcmpps_avx512vl(auVar103,auVar111,1);
  bVar82 = (bool)((byte)uVar85 & 1);
  auVar97._0_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar92._0_4_;
  bVar82 = (bool)((byte)(uVar85 >> 1) & 1);
  auVar97._4_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar92._4_4_;
  bVar82 = (bool)((byte)(uVar85 >> 2) & 1);
  auVar97._8_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar92._8_4_;
  bVar82 = (bool)((byte)(uVar85 >> 3) & 1);
  auVar97._12_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar92._12_4_;
  auVar97._16_4_ = (uint)((byte)(uVar85 >> 4) & 1) * 0x219392ef;
  auVar97._20_4_ = (uint)((byte)(uVar85 >> 5) & 1) * 0x219392ef;
  auVar97._24_4_ = (uint)((byte)(uVar85 >> 6) & 1) * 0x219392ef;
  auVar97._28_4_ = (uint)(byte)(uVar85 >> 7) * 0x219392ef;
  auVar103 = vandps_avx(ZEXT1632(auVar91),auVar177);
  uVar85 = vcmpps_avx512vl(auVar103,auVar111,1);
  bVar82 = (bool)((byte)uVar85 & 1);
  auVar103._0_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar91._0_4_;
  bVar82 = (bool)((byte)(uVar85 >> 1) & 1);
  auVar103._4_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar91._4_4_;
  bVar82 = (bool)((byte)(uVar85 >> 2) & 1);
  auVar103._8_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar91._8_4_;
  bVar82 = (bool)((byte)(uVar85 >> 3) & 1);
  auVar103._12_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar91._12_4_;
  auVar103._16_4_ = (uint)((byte)(uVar85 >> 4) & 1) * 0x219392ef;
  auVar103._20_4_ = (uint)((byte)(uVar85 >> 5) & 1) * 0x219392ef;
  auVar103._24_4_ = (uint)((byte)(uVar85 >> 6) & 1) * 0x219392ef;
  auVar103._28_4_ = (uint)(byte)(uVar85 >> 7) * 0x219392ef;
  auVar102 = vrcp14ps_avx512vl(auVar100);
  auVar112._8_4_ = 0x3f800000;
  auVar112._0_8_ = &DAT_3f8000003f800000;
  auVar112._12_4_ = 0x3f800000;
  auVar112._16_4_ = 0x3f800000;
  auVar112._20_4_ = 0x3f800000;
  auVar112._24_4_ = 0x3f800000;
  auVar112._28_4_ = 0x3f800000;
  auVar22 = vfnmadd213ps_fma(auVar100,auVar102,auVar112);
  auVar22 = vfmadd132ps_fma(ZEXT1632(auVar22),auVar102,auVar102);
  auVar102 = vrcp14ps_avx512vl(auVar97);
  auVar92 = vfnmadd213ps_fma(auVar97,auVar102,auVar112);
  auVar92 = vfmadd132ps_fma(ZEXT1632(auVar92),auVar102,auVar102);
  auVar102 = vrcp14ps_avx512vl(auVar103);
  auVar91 = vfnmadd213ps_fma(auVar103,auVar102,auVar112);
  auVar91 = vfmadd132ps_fma(ZEXT1632(auVar91),auVar102,auVar102);
  auVar103 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar87 * 7 + 6));
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar102 = vsubps_avx512vl(auVar103,auVar101);
  auVar103 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar87 * 9 + 6));
  auVar104._4_4_ = auVar22._4_4_ * auVar102._4_4_;
  auVar104._0_4_ = auVar22._0_4_ * auVar102._0_4_;
  auVar104._8_4_ = auVar22._8_4_ * auVar102._8_4_;
  auVar104._12_4_ = auVar22._12_4_ * auVar102._12_4_;
  auVar104._16_4_ = auVar102._16_4_ * 0.0;
  auVar104._20_4_ = auVar102._20_4_ * 0.0;
  auVar104._24_4_ = auVar102._24_4_ * 0.0;
  auVar104._28_4_ = auVar102._28_4_;
  auVar175 = ZEXT3264(auVar104);
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar103 = vsubps_avx512vl(auVar103,auVar101);
  auVar110._0_4_ = auVar22._0_4_ * auVar103._0_4_;
  auVar110._4_4_ = auVar22._4_4_ * auVar103._4_4_;
  auVar110._8_4_ = auVar22._8_4_ * auVar103._8_4_;
  auVar110._12_4_ = auVar22._12_4_ * auVar103._12_4_;
  auVar110._16_4_ = auVar103._16_4_ * 0.0;
  auVar110._20_4_ = auVar103._20_4_ * 0.0;
  auVar110._24_4_ = auVar103._24_4_ * 0.0;
  auVar110._28_4_ = 0;
  auVar101 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar11 * 0x10 + 6));
  auVar103 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar11 * 0x10 + uVar87 * -2 + 6));
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar103 = vsubps_avx(auVar103,ZEXT1632(auVar196));
  auVar105._4_4_ = auVar92._4_4_ * auVar103._4_4_;
  auVar105._0_4_ = auVar92._0_4_ * auVar103._0_4_;
  auVar105._8_4_ = auVar92._8_4_ * auVar103._8_4_;
  auVar105._12_4_ = auVar92._12_4_ * auVar103._12_4_;
  auVar105._16_4_ = auVar103._16_4_ * 0.0;
  auVar105._20_4_ = auVar103._20_4_ * 0.0;
  auVar105._24_4_ = auVar103._24_4_ * 0.0;
  auVar105._28_4_ = auVar103._28_4_;
  auVar103 = vcvtdq2ps_avx(auVar101);
  auVar103 = vsubps_avx(auVar103,ZEXT1632(auVar196));
  auVar108._0_4_ = auVar92._0_4_ * auVar103._0_4_;
  auVar108._4_4_ = auVar92._4_4_ * auVar103._4_4_;
  auVar108._8_4_ = auVar92._8_4_ * auVar103._8_4_;
  auVar108._12_4_ = auVar92._12_4_ * auVar103._12_4_;
  auVar108._16_4_ = auVar103._16_4_ * 0.0;
  auVar108._20_4_ = auVar103._20_4_ * 0.0;
  auVar108._24_4_ = auVar103._24_4_ * 0.0;
  auVar108._28_4_ = 0;
  auVar103 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar83 + uVar87 + 6));
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar103 = vsubps_avx(auVar103,ZEXT1632(auVar8));
  auVar106._4_4_ = auVar103._4_4_ * auVar91._4_4_;
  auVar106._0_4_ = auVar103._0_4_ * auVar91._0_4_;
  auVar106._8_4_ = auVar103._8_4_ * auVar91._8_4_;
  auVar106._12_4_ = auVar103._12_4_ * auVar91._12_4_;
  auVar106._16_4_ = auVar103._16_4_ * 0.0;
  auVar106._20_4_ = auVar103._20_4_ * 0.0;
  auVar106._24_4_ = auVar103._24_4_ * 0.0;
  auVar106._28_4_ = auVar103._28_4_;
  auVar103 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar87 * 0x17 + 6));
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar103 = vsubps_avx(auVar103,ZEXT1632(auVar8));
  auVar98._0_4_ = auVar91._0_4_ * auVar103._0_4_;
  auVar98._4_4_ = auVar91._4_4_ * auVar103._4_4_;
  auVar98._8_4_ = auVar91._8_4_ * auVar103._8_4_;
  auVar98._12_4_ = auVar91._12_4_ * auVar103._12_4_;
  auVar98._16_4_ = auVar103._16_4_ * 0.0;
  auVar98._20_4_ = auVar103._20_4_ * 0.0;
  auVar98._24_4_ = auVar103._24_4_ * 0.0;
  auVar98._28_4_ = 0;
  auVar103 = vpminsd_avx2(auVar104,auVar110);
  auVar101 = vpminsd_avx2(auVar105,auVar108);
  auVar103 = vmaxps_avx(auVar103,auVar101);
  auVar101 = vpminsd_avx2(auVar106,auVar98);
  uVar145 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar102._4_4_ = uVar145;
  auVar102._0_4_ = uVar145;
  auVar102._8_4_ = uVar145;
  auVar102._12_4_ = uVar145;
  auVar102._16_4_ = uVar145;
  auVar102._20_4_ = uVar145;
  auVar102._24_4_ = uVar145;
  auVar102._28_4_ = uVar145;
  auVar101 = vmaxps_avx512vl(auVar101,auVar102);
  auVar103 = vmaxps_avx(auVar103,auVar101);
  auVar101._8_4_ = 0x3f7ffffa;
  auVar101._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar101._12_4_ = 0x3f7ffffa;
  auVar101._16_4_ = 0x3f7ffffa;
  auVar101._20_4_ = 0x3f7ffffa;
  auVar101._24_4_ = 0x3f7ffffa;
  auVar101._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar103,auVar101);
  auVar103 = vpmaxsd_avx2(auVar104,auVar110);
  auVar153 = ZEXT3264(auVar103);
  auVar101 = vpmaxsd_avx2(auVar105,auVar108);
  auVar103 = vminps_avx(auVar103,auVar101);
  auVar101 = vpmaxsd_avx2(auVar106,auVar98);
  uVar145 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar116._4_4_ = uVar145;
  auVar116._0_4_ = uVar145;
  auVar116._8_4_ = uVar145;
  auVar116._12_4_ = uVar145;
  auVar116._16_4_ = uVar145;
  auVar116._20_4_ = uVar145;
  auVar116._24_4_ = uVar145;
  auVar116._28_4_ = uVar145;
  auVar101 = vminps_avx512vl(auVar101,auVar116);
  auVar103 = vminps_avx(auVar103,auVar101);
  auVar115._8_4_ = 0x3f800003;
  auVar115._0_8_ = 0x3f8000033f800003;
  auVar115._12_4_ = 0x3f800003;
  auVar115._16_4_ = 0x3f800003;
  auVar115._20_4_ = 0x3f800003;
  auVar115._24_4_ = 0x3f800003;
  auVar115._28_4_ = 0x3f800003;
  auVar103 = vmulps_avx512vl(auVar103,auVar115);
  auVar101 = vpbroadcastd_avx512vl();
  uVar23 = vpcmpgtd_avx512vl(auVar101,_DAT_0205a920);
  uVar146 = vcmpps_avx512vl(local_80,auVar103,2);
  local_6f9 = (byte)((byte)uVar146 & (byte)uVar23) != 0;
  if (local_6f9) {
    uVar85 = (ulong)(byte)((byte)uVar146 & (byte)uVar23);
    local_568 = pre->ray_space + k;
    local_490 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    do {
      auVar101 = auVar175._0_32_;
      auVar103 = auVar153._0_32_;
      local_520 = in_ZMM20._0_32_;
      lVar24 = 0;
      for (uVar87 = uVar85; (uVar87 & 1) == 0; uVar87 = uVar87 >> 1 | 0x8000000000000000) {
        lVar24 = lVar24 + 1;
      }
      local_668 = (ulong)*(uint *)(prim + 2);
      pGVar13 = (context->scene->geometries).items[local_668].ptr;
      uVar87 = (ulong)*(uint *)(*(long *)&pGVar13->field_0x58 +
                               pGVar13[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i *
                               (ulong)*(uint *)(prim + lVar24 * 4 + 6));
      p_Var14 = pGVar13[1].intersectionFilterN;
      lVar24 = *(long *)&pGVar13[1].time_range.upper;
      auVar22 = *(undefined1 (*) [16])(lVar24 + (long)p_Var14 * uVar87);
      pauVar3 = (undefined1 (*) [16])(lVar24 + (uVar87 + 1) * (long)p_Var14);
      local_5b0 = *(undefined8 *)*pauVar3;
      uStack_5a8 = *(undefined8 *)(*pauVar3 + 8);
      auVar92 = *pauVar3;
      pauVar4 = (undefined1 (*) [16])(lVar24 + (uVar87 + 2) * (long)p_Var14);
      local_5c0 = *(undefined8 *)*pauVar4;
      uStack_5b8 = *(undefined8 *)(*pauVar4 + 8);
      auVar91 = *pauVar4;
      uVar85 = uVar85 - 1 & uVar85;
      pauVar5 = (undefined1 (*) [16])(lVar24 + (uVar87 + 3) * (long)p_Var14);
      local_580 = *(undefined8 *)*pauVar5;
      uStack_578 = *(undefined8 *)(*pauVar5 + 8);
      auVar196 = *pauVar5;
      if (uVar85 != 0) {
        uVar83 = uVar85 - 1 & uVar85;
        for (uVar87 = uVar85; (uVar87 & 1) == 0; uVar87 = uVar87 >> 1 | 0x8000000000000000) {
        }
        if (uVar83 != 0) {
          for (; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x8000000000000000) {
          }
        }
      }
      iVar12 = (int)pGVar13[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar8 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                             0x1c);
      auVar8 = vinsertps_avx(auVar8,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      auVar90 = vsubps_avx(auVar22,auVar8);
      uVar145 = auVar90._0_4_;
      auVar152._4_4_ = uVar145;
      auVar152._0_4_ = uVar145;
      auVar152._8_4_ = uVar145;
      auVar152._12_4_ = uVar145;
      auVar195 = vshufps_avx(auVar90,auVar90,0x55);
      auVar90 = vshufps_avx(auVar90,auVar90,0xaa);
      aVar6 = (local_568->vx).field_0;
      aVar7 = (local_568->vy).field_0;
      fVar165 = (local_568->vz).field_0.m128[0];
      fVar144 = *(float *)((long)&(local_568->vz).field_0 + 4);
      fVar170 = *(float *)((long)&(local_568->vz).field_0 + 8);
      fVar171 = *(float *)((long)&(local_568->vz).field_0 + 0xc);
      auVar94._0_4_ = fVar165 * auVar90._0_4_;
      auVar94._4_4_ = fVar144 * auVar90._4_4_;
      auVar94._8_4_ = fVar170 * auVar90._8_4_;
      auVar94._12_4_ = fVar171 * auVar90._12_4_;
      auVar195 = vfmadd231ps_fma(auVar94,(undefined1  [16])aVar7,auVar195);
      auVar10 = vfmadd231ps_fma(auVar195,(undefined1  [16])aVar6,auVar152);
      auVar195 = vshufps_avx(auVar22,auVar22,0xff);
      auVar9 = vsubps_avx(auVar92,auVar8);
      uVar145 = auVar9._0_4_;
      auVar93._4_4_ = uVar145;
      auVar93._0_4_ = uVar145;
      auVar93._8_4_ = uVar145;
      auVar93._12_4_ = uVar145;
      auVar90 = vshufps_avx(auVar9,auVar9,0x55);
      auVar9 = vshufps_avx(auVar9,auVar9,0xaa);
      auVar179._0_4_ = fVar165 * auVar9._0_4_;
      auVar179._4_4_ = fVar144 * auVar9._4_4_;
      auVar179._8_4_ = fVar170 * auVar9._8_4_;
      auVar179._12_4_ = fVar171 * auVar9._12_4_;
      auVar90 = vfmadd231ps_fma(auVar179,(undefined1  [16])aVar7,auVar90);
      auVar152 = vfmadd231ps_fma(auVar90,(undefined1  [16])aVar6,auVar93);
      auVar92 = vshufps_avx(auVar92,auVar92,0xff);
      auVar9 = vsubps_avx(auVar91,auVar8);
      uVar145 = auVar9._0_4_;
      auVar176._4_4_ = uVar145;
      auVar176._0_4_ = uVar145;
      auVar176._8_4_ = uVar145;
      auVar176._12_4_ = uVar145;
      auVar90 = vshufps_avx(auVar9,auVar9,0x55);
      auVar9 = vshufps_avx(auVar9,auVar9,0xaa);
      auVar181._0_4_ = fVar165 * auVar9._0_4_;
      auVar181._4_4_ = fVar144 * auVar9._4_4_;
      auVar181._8_4_ = fVar170 * auVar9._8_4_;
      auVar181._12_4_ = fVar171 * auVar9._12_4_;
      auVar90 = vfmadd231ps_fma(auVar181,(undefined1  [16])aVar7,auVar90);
      auVar9 = vfmadd231ps_fma(auVar90,(undefined1  [16])aVar6,auVar176);
      auVar91 = vshufps_avx(auVar91,auVar91,0xff);
      auVar90 = vsubps_avx512vl(auVar196,auVar8);
      uVar145 = auVar90._0_4_;
      auVar156._4_4_ = uVar145;
      auVar156._0_4_ = uVar145;
      auVar156._8_4_ = uVar145;
      auVar156._12_4_ = uVar145;
      auVar8 = vshufps_avx(auVar90,auVar90,0x55);
      auVar90 = vshufps_avx(auVar90,auVar90,0xaa);
      auVar182._0_4_ = fVar165 * auVar90._0_4_;
      auVar182._4_4_ = fVar144 * auVar90._4_4_;
      auVar182._8_4_ = fVar170 * auVar90._8_4_;
      auVar182._12_4_ = fVar171 * auVar90._12_4_;
      auVar8 = vfmadd231ps_fma(auVar182,(undefined1  [16])aVar7,auVar8);
      auVar8 = vfmadd231ps_fma(auVar8,(undefined1  [16])aVar6,auVar156);
      lVar24 = (long)iVar12 * 0x44;
      auVar102 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24);
      auVar90 = vshufps_avx512vl(auVar196,auVar196,0xff);
      local_4c0 = vbroadcastss_avx512vl(auVar10);
      auVar161._8_4_ = 1;
      auVar161._0_8_ = 0x100000001;
      auVar161._12_4_ = 1;
      auVar161._16_4_ = 1;
      auVar161._20_4_ = 1;
      auVar161._24_4_ = 1;
      auVar161._28_4_ = 1;
      local_4e0 = vpermps_avx512vl(auVar161,ZEXT1632(auVar10));
      uVar146 = auVar195._0_8_;
      local_a0._8_8_ = uVar146;
      local_a0._0_8_ = uVar146;
      local_a0._16_8_ = uVar146;
      local_a0._24_8_ = uVar146;
      auVar116 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24 + 0x484);
      uVar145 = auVar152._0_4_;
      local_5a0._4_4_ = uVar145;
      local_5a0._0_4_ = uVar145;
      local_5a0._8_4_ = uVar145;
      local_5a0._12_4_ = uVar145;
      local_5a0._16_4_ = uVar145;
      local_5a0._20_4_ = uVar145;
      local_5a0._24_4_ = uVar145;
      local_5a0._28_4_ = uVar145;
      local_200 = vpermps_avx512vl(auVar161,ZEXT1632(auVar152));
      local_c0 = vbroadcastsd_avx512vl(auVar92);
      auVar115 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24 + 0x908);
      local_e0 = vbroadcastss_avx512vl(auVar9);
      local_100 = vpermps_avx512vl(auVar161,ZEXT1632(auVar9));
      local_120 = vbroadcastsd_avx512vl(auVar91);
      auVar114 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24 + 0xd8c);
      local_140 = vbroadcastss_avx512vl(auVar8);
      local_160 = vpermps_avx512vl(auVar161,ZEXT1632(auVar8));
      uVar146 = auVar90._0_8_;
      register0x000012c8 = uVar146;
      local_180 = uVar146;
      register0x000012d0 = uVar146;
      register0x000012d8 = uVar146;
      auVar104 = vmulps_avx512vl(local_140,auVar114);
      auVar105 = vmulps_avx512vl(local_160,auVar114);
      auVar104 = vfmadd231ps_avx512vl(auVar104,auVar115,local_e0);
      auVar105 = vfmadd231ps_avx512vl(auVar105,auVar115,local_100);
      auVar92 = vfmadd231ps_fma(auVar104,auVar116,local_5a0);
      auVar106 = vfmadd231ps_avx512vl(auVar105,auVar116,local_200);
      auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar92),auVar102,local_4c0);
      auVar104 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24);
      auVar105 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24 + 0x484);
      auVar100 = vfmadd231ps_avx512vl(auVar106,auVar102,local_4e0);
      auVar106 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24 + 0x908);
      auVar113 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24 + 0xd8c);
      auVar107 = vmulps_avx512vl(local_140,auVar113);
      auVar97 = vmulps_avx512vl(local_160,auVar113);
      auVar107 = vfmadd231ps_avx512vl(auVar107,auVar106,local_e0);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar106,local_100);
      auVar107 = vfmadd231ps_avx512vl(auVar107,auVar105,local_5a0);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar105,local_200);
      auVar107 = vfmadd231ps_avx512vl(auVar107,auVar104,local_4c0);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar104,local_4e0);
      auVar98 = vsubps_avx512vl(auVar107,auVar99);
      auVar108 = vsubps_avx512vl(auVar97,auVar100);
      auVar109 = vmulps_avx512vl(auVar100,auVar98);
      auVar110 = vmulps_avx512vl(auVar99,auVar108);
      auVar109 = vsubps_avx512vl(auVar109,auVar110);
      auVar110 = vmulps_avx512vl(_local_180,auVar114);
      auVar110 = vfmadd231ps_avx512vl(auVar110,auVar115,local_120);
      auVar110 = vfmadd231ps_avx512vl(auVar110,auVar116,local_c0);
      auVar110 = vfmadd231ps_avx512vl(auVar110,auVar102,local_a0);
      auVar111 = vmulps_avx512vl(_local_180,auVar113);
      auVar111 = vfmadd231ps_avx512vl(auVar111,auVar106,local_120);
      auVar111 = vfmadd231ps_avx512vl(auVar111,auVar105,local_c0);
      auVar195 = vfmadd231ps_fma(auVar111,auVar104,local_a0);
      auVar111 = vmulps_avx512vl(auVar108,auVar108);
      auVar111 = vfmadd231ps_avx512vl(auVar111,auVar98,auVar98);
      auVar112 = vmaxps_avx512vl(auVar110,ZEXT1632(auVar195));
      auVar112 = vmulps_avx512vl(auVar112,auVar112);
      auVar111 = vmulps_avx512vl(auVar112,auVar111);
      auVar109 = vmulps_avx512vl(auVar109,auVar109);
      uVar146 = vcmpps_avx512vl(auVar109,auVar111,2);
      auVar92 = vblendps_avx(auVar10,auVar22,8);
      auVar90 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar91 = vandps_avx512vl(auVar92,auVar90);
      auVar92 = vblendps_avx(auVar152,*pauVar3,8);
      auVar92 = vandps_avx512vl(auVar92,auVar90);
      auVar91 = vmaxps_avx(auVar91,auVar92);
      auVar92 = vblendps_avx(auVar9,*pauVar4,8);
      auVar93 = vandps_avx512vl(auVar92,auVar90);
      auVar92 = vblendps_avx(auVar8,auVar196,8);
      auVar92 = vandps_avx512vl(auVar92,auVar90);
      auVar92 = vmaxps_avx(auVar93,auVar92);
      auVar92 = vmaxps_avx(auVar91,auVar92);
      auVar91 = vmovshdup_avx(auVar92);
      auVar91 = vmaxss_avx(auVar91,auVar92);
      auVar92 = vshufpd_avx(auVar92,auVar92,1);
      auVar92 = vmaxss_avx(auVar92,auVar91);
      local_5d0._0_4_ = (undefined4)iVar12;
      local_5d0._4_12_ = auVar10._4_12_;
      auVar183._4_4_ = local_5d0._0_4_;
      auVar183._0_4_ = local_5d0._0_4_;
      auVar183._8_4_ = local_5d0._0_4_;
      auVar183._12_4_ = local_5d0._0_4_;
      auVar183._16_4_ = local_5d0._0_4_;
      auVar183._20_4_ = local_5d0._0_4_;
      auVar183._24_4_ = local_5d0._0_4_;
      auVar183._28_4_ = local_5d0._0_4_;
      uVar23 = vcmpps_avx512vl(auVar183,_DAT_02020f40,0xe);
      local_310 = (byte)uVar146 & (byte)uVar23;
      local_480 = auVar92._0_4_ * 4.7683716e-07;
      auVar162._8_4_ = 2;
      auVar162._0_8_ = 0x200000002;
      auVar162._12_4_ = 2;
      auVar162._16_4_ = 2;
      auVar162._20_4_ = 2;
      auVar162._24_4_ = 2;
      auVar162._28_4_ = 2;
      local_1a0 = vpermps_avx512vl(auVar162,ZEXT1632(auVar10));
      local_1c0 = vpermps_avx512vl(auVar162,ZEXT1632(auVar152));
      local_1e0 = vpermps_avx512vl(auVar162,ZEXT1632(auVar9));
      local_500 = vpermps_avx2(auVar162,ZEXT1632(auVar8));
      uVar84 = *(uint *)(ray + k * 4 + 0x30);
      auVar92 = local_160._0_16_;
      local_630 = ZEXT416((uint)local_480);
      if (local_310 == 0) {
        bVar82 = false;
        auVar92 = vxorps_avx512vl(auVar92,auVar92);
        auVar197 = ZEXT1664(auVar92);
        auVar175 = ZEXT3264(auVar101);
        in_ZMM20 = ZEXT3264(local_520);
        auVar153 = ZEXT3264(auVar103);
        auVar193 = ZEXT3264(local_540);
        auVar194 = ZEXT3264(local_4c0);
        auVar192 = ZEXT3264(local_4e0);
        auVar191 = ZEXT3264(local_5a0);
      }
      else {
        local_560._0_16_ = ZEXT416(uVar84);
        auVar113 = vmulps_avx512vl(local_500,auVar113);
        auVar106 = vfmadd213ps_avx512vl(auVar106,local_1e0,auVar113);
        auVar105 = vfmadd213ps_avx512vl(auVar105,local_1c0,auVar106);
        auVar105 = vfmadd213ps_avx512vl(auVar104,local_1a0,auVar105);
        auVar114 = vmulps_avx512vl(local_500,auVar114);
        auVar115 = vfmadd213ps_avx512vl(auVar115,local_1e0,auVar114);
        auVar106 = vfmadd213ps_avx512vl(auVar116,local_1c0,auVar115);
        auVar116 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24 + 0x1210);
        auVar115 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24 + 0x1694);
        auVar114 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24 + 0x1b18);
        auVar104 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24 + 0x1f9c);
        auVar106 = vfmadd213ps_avx512vl(auVar102,local_1a0,auVar106);
        auVar102 = vmulps_avx512vl(local_140,auVar104);
        auVar113 = vmulps_avx512vl(local_160,auVar104);
        auVar33._4_4_ = local_500._4_4_ * auVar104._4_4_;
        auVar33._0_4_ = local_500._0_4_ * auVar104._0_4_;
        auVar33._8_4_ = local_500._8_4_ * auVar104._8_4_;
        auVar33._12_4_ = local_500._12_4_ * auVar104._12_4_;
        auVar33._16_4_ = local_500._16_4_ * auVar104._16_4_;
        auVar33._20_4_ = local_500._20_4_ * auVar104._20_4_;
        auVar33._24_4_ = local_500._24_4_ * auVar104._24_4_;
        auVar33._28_4_ = auVar104._28_4_;
        auVar102 = vfmadd231ps_avx512vl(auVar102,auVar114,local_e0);
        auVar104 = vfmadd231ps_avx512vl(auVar113,auVar114,local_100);
        auVar114 = vfmadd231ps_avx512vl(auVar33,local_1e0,auVar114);
        auVar102 = vfmadd231ps_avx512vl(auVar102,auVar115,local_5a0);
        auVar104 = vfmadd231ps_avx512vl(auVar104,auVar115,local_200);
        auVar113 = vfmadd231ps_avx512vl(auVar114,local_1c0,auVar115);
        auVar109 = vfmadd231ps_avx512vl(auVar102,auVar116,local_4c0);
        auVar192 = ZEXT3264(local_4e0);
        auVar104 = vfmadd231ps_avx512vl(auVar104,auVar116,local_4e0);
        auVar102 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24 + 0x1210);
        auVar115 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24 + 0x1b18);
        auVar114 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24 + 0x1f9c);
        auVar113 = vfmadd231ps_avx512vl(auVar113,local_1a0,auVar116);
        auVar116 = vmulps_avx512vl(local_140,auVar114);
        auVar111 = vmulps_avx512vl(local_160,auVar114);
        auVar34._4_4_ = local_500._4_4_ * auVar114._4_4_;
        auVar34._0_4_ = local_500._0_4_ * auVar114._0_4_;
        auVar34._8_4_ = local_500._8_4_ * auVar114._8_4_;
        auVar34._12_4_ = local_500._12_4_ * auVar114._12_4_;
        auVar34._16_4_ = local_500._16_4_ * auVar114._16_4_;
        auVar34._20_4_ = local_500._20_4_ * auVar114._20_4_;
        auVar34._24_4_ = local_500._24_4_ * auVar114._24_4_;
        auVar34._28_4_ = auVar114._28_4_;
        auVar114 = vfmadd231ps_avx512vl(auVar116,auVar115,local_e0);
        auVar111 = vfmadd231ps_avx512vl(auVar111,auVar115,local_100);
        auVar115 = vfmadd231ps_avx512vl(auVar34,local_1e0,auVar115);
        auVar116 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24 + 0x1694);
        auVar114 = vfmadd231ps_avx512vl(auVar114,auVar116,local_5a0);
        auVar111 = vfmadd231ps_avx512vl(auVar111,auVar116,local_200);
        auVar116 = vfmadd231ps_avx512vl(auVar115,local_1c0,auVar116);
        auVar115 = vfmadd231ps_avx512vl(auVar114,auVar102,local_4c0);
        auVar114 = vfmadd231ps_avx512vl(auVar111,auVar102,local_4e0);
        auVar111 = vfmadd231ps_avx512vl(auVar116,local_1a0,auVar102);
        auVar189._8_4_ = 0x7fffffff;
        auVar189._0_8_ = 0x7fffffff7fffffff;
        auVar189._12_4_ = 0x7fffffff;
        auVar189._16_4_ = 0x7fffffff;
        auVar189._20_4_ = 0x7fffffff;
        auVar189._24_4_ = 0x7fffffff;
        auVar189._28_4_ = 0x7fffffff;
        auVar102 = vandps_avx(auVar109,auVar189);
        auVar116 = vandps_avx(auVar104,auVar189);
        auVar116 = vmaxps_avx(auVar102,auVar116);
        auVar102 = vandps_avx(auVar113,auVar189);
        auVar102 = vmaxps_avx(auVar116,auVar102);
        auVar113 = vbroadcastss_avx512vl(local_630);
        uVar87 = vcmpps_avx512vl(auVar102,auVar113,1);
        bVar82 = (bool)((byte)uVar87 & 1);
        auVar117._0_4_ = (float)((uint)bVar82 * auVar98._0_4_ | (uint)!bVar82 * auVar109._0_4_);
        bVar82 = (bool)((byte)(uVar87 >> 1) & 1);
        auVar117._4_4_ = (float)((uint)bVar82 * auVar98._4_4_ | (uint)!bVar82 * auVar109._4_4_);
        bVar82 = (bool)((byte)(uVar87 >> 2) & 1);
        auVar117._8_4_ = (float)((uint)bVar82 * auVar98._8_4_ | (uint)!bVar82 * auVar109._8_4_);
        bVar82 = (bool)((byte)(uVar87 >> 3) & 1);
        auVar117._12_4_ = (float)((uint)bVar82 * auVar98._12_4_ | (uint)!bVar82 * auVar109._12_4_);
        bVar82 = (bool)((byte)(uVar87 >> 4) & 1);
        auVar117._16_4_ = (float)((uint)bVar82 * auVar98._16_4_ | (uint)!bVar82 * auVar109._16_4_);
        bVar82 = (bool)((byte)(uVar87 >> 5) & 1);
        auVar117._20_4_ = (float)((uint)bVar82 * auVar98._20_4_ | (uint)!bVar82 * auVar109._20_4_);
        bVar82 = (bool)((byte)(uVar87 >> 6) & 1);
        auVar117._24_4_ = (float)((uint)bVar82 * auVar98._24_4_ | (uint)!bVar82 * auVar109._24_4_);
        bVar82 = SUB81(uVar87 >> 7,0);
        auVar117._28_4_ = (uint)bVar82 * auVar98._28_4_ | (uint)!bVar82 * auVar109._28_4_;
        bVar82 = (bool)((byte)uVar87 & 1);
        auVar118._0_4_ = (float)((uint)bVar82 * auVar108._0_4_ | (uint)!bVar82 * auVar104._0_4_);
        bVar82 = (bool)((byte)(uVar87 >> 1) & 1);
        auVar118._4_4_ = (float)((uint)bVar82 * auVar108._4_4_ | (uint)!bVar82 * auVar104._4_4_);
        bVar82 = (bool)((byte)(uVar87 >> 2) & 1);
        auVar118._8_4_ = (float)((uint)bVar82 * auVar108._8_4_ | (uint)!bVar82 * auVar104._8_4_);
        bVar82 = (bool)((byte)(uVar87 >> 3) & 1);
        auVar118._12_4_ = (float)((uint)bVar82 * auVar108._12_4_ | (uint)!bVar82 * auVar104._12_4_);
        bVar82 = (bool)((byte)(uVar87 >> 4) & 1);
        auVar118._16_4_ = (float)((uint)bVar82 * auVar108._16_4_ | (uint)!bVar82 * auVar104._16_4_);
        bVar82 = (bool)((byte)(uVar87 >> 5) & 1);
        auVar118._20_4_ = (float)((uint)bVar82 * auVar108._20_4_ | (uint)!bVar82 * auVar104._20_4_);
        bVar82 = (bool)((byte)(uVar87 >> 6) & 1);
        auVar118._24_4_ = (float)((uint)bVar82 * auVar108._24_4_ | (uint)!bVar82 * auVar104._24_4_);
        bVar82 = SUB81(uVar87 >> 7,0);
        auVar118._28_4_ = (uint)bVar82 * auVar108._28_4_ | (uint)!bVar82 * auVar104._28_4_;
        auVar102 = vandps_avx(auVar189,auVar115);
        auVar116 = vandps_avx(auVar114,auVar189);
        auVar116 = vmaxps_avx(auVar102,auVar116);
        auVar102 = vandps_avx(auVar111,auVar189);
        auVar102 = vmaxps_avx(auVar116,auVar102);
        uVar87 = vcmpps_avx512vl(auVar102,auVar113,1);
        bVar82 = (bool)((byte)uVar87 & 1);
        auVar119._0_4_ = (float)((uint)bVar82 * auVar98._0_4_ | (uint)!bVar82 * auVar115._0_4_);
        bVar82 = (bool)((byte)(uVar87 >> 1) & 1);
        auVar119._4_4_ = (float)((uint)bVar82 * auVar98._4_4_ | (uint)!bVar82 * auVar115._4_4_);
        bVar82 = (bool)((byte)(uVar87 >> 2) & 1);
        auVar119._8_4_ = (float)((uint)bVar82 * auVar98._8_4_ | (uint)!bVar82 * auVar115._8_4_);
        bVar82 = (bool)((byte)(uVar87 >> 3) & 1);
        auVar119._12_4_ = (float)((uint)bVar82 * auVar98._12_4_ | (uint)!bVar82 * auVar115._12_4_);
        bVar82 = (bool)((byte)(uVar87 >> 4) & 1);
        auVar119._16_4_ = (float)((uint)bVar82 * auVar98._16_4_ | (uint)!bVar82 * auVar115._16_4_);
        bVar82 = (bool)((byte)(uVar87 >> 5) & 1);
        auVar119._20_4_ = (float)((uint)bVar82 * auVar98._20_4_ | (uint)!bVar82 * auVar115._20_4_);
        bVar82 = (bool)((byte)(uVar87 >> 6) & 1);
        auVar119._24_4_ = (float)((uint)bVar82 * auVar98._24_4_ | (uint)!bVar82 * auVar115._24_4_);
        bVar82 = SUB81(uVar87 >> 7,0);
        auVar119._28_4_ = (uint)bVar82 * auVar98._28_4_ | (uint)!bVar82 * auVar115._28_4_;
        bVar82 = (bool)((byte)uVar87 & 1);
        auVar120._0_4_ = (float)((uint)bVar82 * auVar108._0_4_ | (uint)!bVar82 * auVar114._0_4_);
        bVar82 = (bool)((byte)(uVar87 >> 1) & 1);
        auVar120._4_4_ = (float)((uint)bVar82 * auVar108._4_4_ | (uint)!bVar82 * auVar114._4_4_);
        bVar82 = (bool)((byte)(uVar87 >> 2) & 1);
        auVar120._8_4_ = (float)((uint)bVar82 * auVar108._8_4_ | (uint)!bVar82 * auVar114._8_4_);
        bVar82 = (bool)((byte)(uVar87 >> 3) & 1);
        auVar120._12_4_ = (float)((uint)bVar82 * auVar108._12_4_ | (uint)!bVar82 * auVar114._12_4_);
        bVar82 = (bool)((byte)(uVar87 >> 4) & 1);
        auVar120._16_4_ = (float)((uint)bVar82 * auVar108._16_4_ | (uint)!bVar82 * auVar114._16_4_);
        bVar82 = (bool)((byte)(uVar87 >> 5) & 1);
        auVar120._20_4_ = (float)((uint)bVar82 * auVar108._20_4_ | (uint)!bVar82 * auVar114._20_4_);
        bVar82 = (bool)((byte)(uVar87 >> 6) & 1);
        auVar120._24_4_ = (float)((uint)bVar82 * auVar108._24_4_ | (uint)!bVar82 * auVar114._24_4_);
        bVar82 = SUB81(uVar87 >> 7,0);
        auVar120._28_4_ = (uint)bVar82 * auVar108._28_4_ | (uint)!bVar82 * auVar114._28_4_;
        auVar94 = vxorps_avx512vl(auVar92,auVar92);
        auVar197 = ZEXT1664(auVar94);
        auVar102 = vfmadd213ps_avx512vl(auVar117,auVar117,ZEXT1632(auVar94));
        auVar92 = vfmadd231ps_fma(auVar102,auVar118,auVar118);
        auVar102 = vrsqrt14ps_avx512vl(ZEXT1632(auVar92));
        fVar165 = auVar102._0_4_;
        fVar144 = auVar102._4_4_;
        fVar170 = auVar102._8_4_;
        fVar171 = auVar102._12_4_;
        fVar155 = auVar102._16_4_;
        fVar164 = auVar102._20_4_;
        fVar88 = auVar102._24_4_;
        auVar35._4_4_ = fVar144 * fVar144 * fVar144 * auVar92._4_4_ * -0.5;
        auVar35._0_4_ = fVar165 * fVar165 * fVar165 * auVar92._0_4_ * -0.5;
        auVar35._8_4_ = fVar170 * fVar170 * fVar170 * auVar92._8_4_ * -0.5;
        auVar35._12_4_ = fVar171 * fVar171 * fVar171 * auVar92._12_4_ * -0.5;
        auVar35._16_4_ = fVar155 * fVar155 * fVar155 * -0.0;
        auVar35._20_4_ = fVar164 * fVar164 * fVar164 * -0.0;
        auVar35._24_4_ = fVar88 * fVar88 * fVar88 * -0.0;
        auVar35._28_4_ = 0;
        auVar116 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar115 = vfmadd231ps_avx512vl(auVar35,auVar116,auVar102);
        auVar36._4_4_ = auVar118._4_4_ * auVar115._4_4_;
        auVar36._0_4_ = auVar118._0_4_ * auVar115._0_4_;
        auVar36._8_4_ = auVar118._8_4_ * auVar115._8_4_;
        auVar36._12_4_ = auVar118._12_4_ * auVar115._12_4_;
        auVar36._16_4_ = auVar118._16_4_ * auVar115._16_4_;
        auVar36._20_4_ = auVar118._20_4_ * auVar115._20_4_;
        auVar36._24_4_ = auVar118._24_4_ * auVar115._24_4_;
        auVar36._28_4_ = auVar102._28_4_;
        auVar37._4_4_ = auVar115._4_4_ * -auVar117._4_4_;
        auVar37._0_4_ = auVar115._0_4_ * -auVar117._0_4_;
        auVar37._8_4_ = auVar115._8_4_ * -auVar117._8_4_;
        auVar37._12_4_ = auVar115._12_4_ * -auVar117._12_4_;
        auVar37._16_4_ = auVar115._16_4_ * -auVar117._16_4_;
        auVar37._20_4_ = auVar115._20_4_ * -auVar117._20_4_;
        auVar37._24_4_ = auVar115._24_4_ * -auVar117._24_4_;
        auVar37._28_4_ = auVar117._28_4_ ^ 0x80000000;
        auVar102 = vmulps_avx512vl(auVar115,ZEXT1632(auVar94));
        auVar98 = ZEXT1632(auVar94);
        auVar114 = vfmadd213ps_avx512vl(auVar119,auVar119,auVar98);
        auVar92 = vfmadd231ps_fma(auVar114,auVar120,auVar120);
        auVar114 = vrsqrt14ps_avx512vl(ZEXT1632(auVar92));
        fVar165 = auVar114._0_4_;
        fVar144 = auVar114._4_4_;
        fVar170 = auVar114._8_4_;
        fVar171 = auVar114._12_4_;
        fVar155 = auVar114._16_4_;
        fVar164 = auVar114._20_4_;
        fVar88 = auVar114._24_4_;
        auVar38._4_4_ = fVar144 * fVar144 * fVar144 * auVar92._4_4_ * -0.5;
        auVar38._0_4_ = fVar165 * fVar165 * fVar165 * auVar92._0_4_ * -0.5;
        auVar38._8_4_ = fVar170 * fVar170 * fVar170 * auVar92._8_4_ * -0.5;
        auVar38._12_4_ = fVar171 * fVar171 * fVar171 * auVar92._12_4_ * -0.5;
        auVar38._16_4_ = fVar155 * fVar155 * fVar155 * -0.0;
        auVar38._20_4_ = fVar164 * fVar164 * fVar164 * -0.0;
        auVar38._24_4_ = fVar88 * fVar88 * fVar88 * -0.0;
        auVar38._28_4_ = 0;
        auVar116 = vfmadd231ps_avx512vl(auVar38,auVar116,auVar114);
        auVar39._4_4_ = auVar120._4_4_ * auVar116._4_4_;
        auVar39._0_4_ = auVar120._0_4_ * auVar116._0_4_;
        auVar39._8_4_ = auVar120._8_4_ * auVar116._8_4_;
        auVar39._12_4_ = auVar120._12_4_ * auVar116._12_4_;
        auVar39._16_4_ = auVar120._16_4_ * auVar116._16_4_;
        auVar39._20_4_ = auVar120._20_4_ * auVar116._20_4_;
        auVar39._24_4_ = auVar120._24_4_ * auVar116._24_4_;
        auVar39._28_4_ = auVar114._28_4_;
        auVar40._4_4_ = -auVar119._4_4_ * auVar116._4_4_;
        auVar40._0_4_ = -auVar119._0_4_ * auVar116._0_4_;
        auVar40._8_4_ = -auVar119._8_4_ * auVar116._8_4_;
        auVar40._12_4_ = -auVar119._12_4_ * auVar116._12_4_;
        auVar40._16_4_ = -auVar119._16_4_ * auVar116._16_4_;
        auVar40._20_4_ = -auVar119._20_4_ * auVar116._20_4_;
        auVar40._24_4_ = -auVar119._24_4_ * auVar116._24_4_;
        auVar40._28_4_ = auVar115._28_4_;
        auVar116 = vmulps_avx512vl(auVar116,auVar98);
        auVar92 = vfmadd213ps_fma(auVar36,auVar110,auVar99);
        auVar91 = vfmadd213ps_fma(auVar37,auVar110,auVar100);
        auVar115 = vfmadd213ps_avx512vl(auVar102,auVar110,auVar106);
        auVar114 = vfmadd213ps_avx512vl(auVar39,ZEXT1632(auVar195),auVar107);
        auVar10 = vfnmadd213ps_fma(auVar36,auVar110,auVar99);
        auVar113 = ZEXT1632(auVar195);
        auVar196 = vfmadd213ps_fma(auVar40,auVar113,auVar97);
        auVar152 = vfnmadd213ps_fma(auVar37,auVar110,auVar100);
        auVar8 = vfmadd213ps_fma(auVar116,auVar113,auVar105);
        auVar104 = vfnmadd231ps_avx512vl(auVar106,auVar110,auVar102);
        auVar93 = vfnmadd213ps_fma(auVar39,auVar113,auVar107);
        auVar156 = vfnmadd213ps_fma(auVar40,auVar113,auVar97);
        auVar176 = vfnmadd231ps_fma(auVar105,ZEXT1632(auVar195),auVar116);
        auVar116 = vsubps_avx512vl(auVar114,ZEXT1632(auVar10));
        auVar102 = vsubps_avx(ZEXT1632(auVar196),ZEXT1632(auVar152));
        auVar105 = vsubps_avx512vl(ZEXT1632(auVar8),auVar104);
        auVar106 = vmulps_avx512vl(auVar102,auVar104);
        auVar90 = vfmsub231ps_fma(auVar106,ZEXT1632(auVar152),auVar105);
        auVar41._4_4_ = auVar10._4_4_ * auVar105._4_4_;
        auVar41._0_4_ = auVar10._0_4_ * auVar105._0_4_;
        auVar41._8_4_ = auVar10._8_4_ * auVar105._8_4_;
        auVar41._12_4_ = auVar10._12_4_ * auVar105._12_4_;
        auVar41._16_4_ = auVar105._16_4_ * 0.0;
        auVar41._20_4_ = auVar105._20_4_ * 0.0;
        auVar41._24_4_ = auVar105._24_4_ * 0.0;
        auVar41._28_4_ = auVar105._28_4_;
        auVar105 = vfmsub231ps_avx512vl(auVar41,auVar104,auVar116);
        auVar42._4_4_ = auVar152._4_4_ * auVar116._4_4_;
        auVar42._0_4_ = auVar152._0_4_ * auVar116._0_4_;
        auVar42._8_4_ = auVar152._8_4_ * auVar116._8_4_;
        auVar42._12_4_ = auVar152._12_4_ * auVar116._12_4_;
        auVar42._16_4_ = auVar116._16_4_ * 0.0;
        auVar42._20_4_ = auVar116._20_4_ * 0.0;
        auVar42._24_4_ = auVar116._24_4_ * 0.0;
        auVar42._28_4_ = auVar116._28_4_;
        auVar9 = vfmsub231ps_fma(auVar42,ZEXT1632(auVar10),auVar102);
        auVar102 = vfmadd231ps_avx512vl(ZEXT1632(auVar9),auVar98,auVar105);
        auVar102 = vfmadd231ps_avx512vl(auVar102,auVar98,ZEXT1632(auVar90));
        auVar97 = ZEXT1632(auVar94);
        uVar87 = vcmpps_avx512vl(auVar102,auVar97,2);
        bVar80 = (byte)uVar87;
        fVar88 = (float)((uint)(bVar80 & 1) * auVar92._0_4_ |
                        (uint)!(bool)(bVar80 & 1) * auVar93._0_4_);
        bVar82 = (bool)((byte)(uVar87 >> 1) & 1);
        fVar154 = (float)((uint)bVar82 * auVar92._4_4_ | (uint)!bVar82 * auVar93._4_4_);
        bVar82 = (bool)((byte)(uVar87 >> 2) & 1);
        fVar137 = (float)((uint)bVar82 * auVar92._8_4_ | (uint)!bVar82 * auVar93._8_4_);
        bVar82 = (bool)((byte)(uVar87 >> 3) & 1);
        fVar140 = (float)((uint)bVar82 * auVar92._12_4_ | (uint)!bVar82 * auVar93._12_4_);
        auVar106 = ZEXT1632(CONCAT412(fVar140,CONCAT48(fVar137,CONCAT44(fVar154,fVar88))));
        fVar89 = (float)((uint)(bVar80 & 1) * auVar91._0_4_ |
                        (uint)!(bool)(bVar80 & 1) * auVar156._0_4_);
        bVar82 = (bool)((byte)(uVar87 >> 1) & 1);
        fVar136 = (float)((uint)bVar82 * auVar91._4_4_ | (uint)!bVar82 * auVar156._4_4_);
        bVar82 = (bool)((byte)(uVar87 >> 2) & 1);
        fVar138 = (float)((uint)bVar82 * auVar91._8_4_ | (uint)!bVar82 * auVar156._8_4_);
        bVar82 = (bool)((byte)(uVar87 >> 3) & 1);
        fVar141 = (float)((uint)bVar82 * auVar91._12_4_ | (uint)!bVar82 * auVar156._12_4_);
        auVar113 = ZEXT1632(CONCAT412(fVar141,CONCAT48(fVar138,CONCAT44(fVar136,fVar89))));
        auVar121._0_4_ =
             (float)((uint)(bVar80 & 1) * auVar115._0_4_ |
                    (uint)!(bool)(bVar80 & 1) * auVar176._0_4_);
        bVar82 = (bool)((byte)(uVar87 >> 1) & 1);
        auVar121._4_4_ = (float)((uint)bVar82 * auVar115._4_4_ | (uint)!bVar82 * auVar176._4_4_);
        bVar82 = (bool)((byte)(uVar87 >> 2) & 1);
        auVar121._8_4_ = (float)((uint)bVar82 * auVar115._8_4_ | (uint)!bVar82 * auVar176._8_4_);
        bVar82 = (bool)((byte)(uVar87 >> 3) & 1);
        auVar121._12_4_ = (float)((uint)bVar82 * auVar115._12_4_ | (uint)!bVar82 * auVar176._12_4_);
        fVar144 = (float)((uint)((byte)(uVar87 >> 4) & 1) * auVar115._16_4_);
        auVar121._16_4_ = fVar144;
        fVar165 = (float)((uint)((byte)(uVar87 >> 5) & 1) * auVar115._20_4_);
        auVar121._20_4_ = fVar165;
        fVar170 = (float)((uint)((byte)(uVar87 >> 6) & 1) * auVar115._24_4_);
        auVar121._24_4_ = fVar170;
        iVar1 = (uint)(byte)(uVar87 >> 7) * auVar115._28_4_;
        auVar121._28_4_ = iVar1;
        auVar116 = vblendmps_avx512vl(ZEXT1632(auVar10),auVar114);
        auVar122._0_4_ =
             (uint)(bVar80 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar80 & 1) * auVar90._0_4_;
        bVar82 = (bool)((byte)(uVar87 >> 1) & 1);
        auVar122._4_4_ = (uint)bVar82 * auVar116._4_4_ | (uint)!bVar82 * auVar90._4_4_;
        bVar82 = (bool)((byte)(uVar87 >> 2) & 1);
        auVar122._8_4_ = (uint)bVar82 * auVar116._8_4_ | (uint)!bVar82 * auVar90._8_4_;
        bVar82 = (bool)((byte)(uVar87 >> 3) & 1);
        auVar122._12_4_ = (uint)bVar82 * auVar116._12_4_ | (uint)!bVar82 * auVar90._12_4_;
        auVar122._16_4_ = (uint)((byte)(uVar87 >> 4) & 1) * auVar116._16_4_;
        auVar122._20_4_ = (uint)((byte)(uVar87 >> 5) & 1) * auVar116._20_4_;
        auVar122._24_4_ = (uint)((byte)(uVar87 >> 6) & 1) * auVar116._24_4_;
        auVar122._28_4_ = (uint)(byte)(uVar87 >> 7) * auVar116._28_4_;
        auVar116 = vblendmps_avx512vl(ZEXT1632(auVar152),ZEXT1632(auVar196));
        auVar123._0_4_ =
             (float)((uint)(bVar80 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar80 & 1) * auVar91._0_4_
                    );
        bVar82 = (bool)((byte)(uVar87 >> 1) & 1);
        auVar123._4_4_ = (float)((uint)bVar82 * auVar116._4_4_ | (uint)!bVar82 * auVar91._4_4_);
        bVar82 = (bool)((byte)(uVar87 >> 2) & 1);
        auVar123._8_4_ = (float)((uint)bVar82 * auVar116._8_4_ | (uint)!bVar82 * auVar91._8_4_);
        bVar82 = (bool)((byte)(uVar87 >> 3) & 1);
        auVar123._12_4_ = (float)((uint)bVar82 * auVar116._12_4_ | (uint)!bVar82 * auVar91._12_4_);
        fVar171 = (float)((uint)((byte)(uVar87 >> 4) & 1) * auVar116._16_4_);
        auVar123._16_4_ = fVar171;
        fVar155 = (float)((uint)((byte)(uVar87 >> 5) & 1) * auVar116._20_4_);
        auVar123._20_4_ = fVar155;
        fVar164 = (float)((uint)((byte)(uVar87 >> 6) & 1) * auVar116._24_4_);
        auVar123._24_4_ = fVar164;
        auVar123._28_4_ = (uint)(byte)(uVar87 >> 7) * auVar116._28_4_;
        auVar116 = vblendmps_avx512vl(auVar104,ZEXT1632(auVar8));
        auVar124._0_4_ =
             (float)((uint)(bVar80 & 1) * auVar116._0_4_ |
                    (uint)!(bool)(bVar80 & 1) * auVar115._0_4_);
        bVar82 = (bool)((byte)(uVar87 >> 1) & 1);
        auVar124._4_4_ = (float)((uint)bVar82 * auVar116._4_4_ | (uint)!bVar82 * auVar115._4_4_);
        bVar82 = (bool)((byte)(uVar87 >> 2) & 1);
        auVar124._8_4_ = (float)((uint)bVar82 * auVar116._8_4_ | (uint)!bVar82 * auVar115._8_4_);
        bVar82 = (bool)((byte)(uVar87 >> 3) & 1);
        auVar124._12_4_ = (float)((uint)bVar82 * auVar116._12_4_ | (uint)!bVar82 * auVar115._12_4_);
        bVar82 = (bool)((byte)(uVar87 >> 4) & 1);
        auVar124._16_4_ = (float)((uint)bVar82 * auVar116._16_4_ | (uint)!bVar82 * auVar115._16_4_);
        bVar82 = (bool)((byte)(uVar87 >> 5) & 1);
        auVar124._20_4_ = (float)((uint)bVar82 * auVar116._20_4_ | (uint)!bVar82 * auVar115._20_4_);
        bVar82 = (bool)((byte)(uVar87 >> 6) & 1);
        auVar124._24_4_ = (float)((uint)bVar82 * auVar116._24_4_ | (uint)!bVar82 * auVar115._24_4_);
        bVar82 = SUB81(uVar87 >> 7,0);
        auVar124._28_4_ = (uint)bVar82 * auVar116._28_4_ | (uint)!bVar82 * auVar115._28_4_;
        auVar125._0_4_ =
             (uint)(bVar80 & 1) * (int)auVar10._0_4_ | (uint)!(bool)(bVar80 & 1) * auVar114._0_4_;
        bVar82 = (bool)((byte)(uVar87 >> 1) & 1);
        auVar125._4_4_ = (uint)bVar82 * (int)auVar10._4_4_ | (uint)!bVar82 * auVar114._4_4_;
        bVar82 = (bool)((byte)(uVar87 >> 2) & 1);
        auVar125._8_4_ = (uint)bVar82 * (int)auVar10._8_4_ | (uint)!bVar82 * auVar114._8_4_;
        bVar82 = (bool)((byte)(uVar87 >> 3) & 1);
        auVar125._12_4_ = (uint)bVar82 * (int)auVar10._12_4_ | (uint)!bVar82 * auVar114._12_4_;
        auVar125._16_4_ = (uint)!(bool)((byte)(uVar87 >> 4) & 1) * auVar114._16_4_;
        auVar125._20_4_ = (uint)!(bool)((byte)(uVar87 >> 5) & 1) * auVar114._20_4_;
        auVar125._24_4_ = (uint)!(bool)((byte)(uVar87 >> 6) & 1) * auVar114._24_4_;
        auVar125._28_4_ = (uint)!SUB81(uVar87 >> 7,0) * auVar114._28_4_;
        bVar82 = (bool)((byte)(uVar87 >> 1) & 1);
        bVar16 = (bool)((byte)(uVar87 >> 2) & 1);
        bVar17 = (bool)((byte)(uVar87 >> 3) & 1);
        auVar126._0_4_ =
             (uint)(bVar80 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar80 & 1) * auVar8._0_4_;
        bVar15 = (bool)((byte)(uVar87 >> 1) & 1);
        auVar126._4_4_ = (uint)bVar15 * auVar104._4_4_ | (uint)!bVar15 * auVar8._4_4_;
        bVar15 = (bool)((byte)(uVar87 >> 2) & 1);
        auVar126._8_4_ = (uint)bVar15 * auVar104._8_4_ | (uint)!bVar15 * auVar8._8_4_;
        bVar15 = (bool)((byte)(uVar87 >> 3) & 1);
        auVar126._12_4_ = (uint)bVar15 * auVar104._12_4_ | (uint)!bVar15 * auVar8._12_4_;
        auVar126._16_4_ = (uint)((byte)(uVar87 >> 4) & 1) * auVar104._16_4_;
        auVar126._20_4_ = (uint)((byte)(uVar87 >> 5) & 1) * auVar104._20_4_;
        auVar126._24_4_ = (uint)((byte)(uVar87 >> 6) & 1) * auVar104._24_4_;
        iVar2 = (uint)(byte)(uVar87 >> 7) * auVar104._28_4_;
        auVar126._28_4_ = iVar2;
        auVar99 = vsubps_avx512vl(auVar125,auVar106);
        auVar116 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar152._12_4_ |
                                                 (uint)!bVar17 * auVar196._12_4_,
                                                 CONCAT48((uint)bVar16 * (int)auVar152._8_4_ |
                                                          (uint)!bVar16 * auVar196._8_4_,
                                                          CONCAT44((uint)bVar82 *
                                                                   (int)auVar152._4_4_ |
                                                                   (uint)!bVar82 * auVar196._4_4_,
                                                                   (uint)(bVar80 & 1) *
                                                                   (int)auVar152._0_4_ |
                                                                   (uint)!(bool)(bVar80 & 1) *
                                                                   auVar196._0_4_)))),auVar113);
        auVar115 = vsubps_avx(auVar126,auVar121);
        auVar114 = vsubps_avx(auVar106,auVar122);
        auVar104 = vsubps_avx(auVar113,auVar123);
        auVar105 = vsubps_avx(auVar121,auVar124);
        auVar43._4_4_ = auVar115._4_4_ * fVar154;
        auVar43._0_4_ = auVar115._0_4_ * fVar88;
        auVar43._8_4_ = auVar115._8_4_ * fVar137;
        auVar43._12_4_ = auVar115._12_4_ * fVar140;
        auVar43._16_4_ = auVar115._16_4_ * 0.0;
        auVar43._20_4_ = auVar115._20_4_ * 0.0;
        auVar43._24_4_ = auVar115._24_4_ * 0.0;
        auVar43._28_4_ = iVar2;
        auVar92 = vfmsub231ps_fma(auVar43,auVar121,auVar99);
        auVar44._4_4_ = fVar136 * auVar99._4_4_;
        auVar44._0_4_ = fVar89 * auVar99._0_4_;
        auVar44._8_4_ = fVar138 * auVar99._8_4_;
        auVar44._12_4_ = fVar141 * auVar99._12_4_;
        auVar44._16_4_ = auVar99._16_4_ * 0.0;
        auVar44._20_4_ = auVar99._20_4_ * 0.0;
        auVar44._24_4_ = auVar99._24_4_ * 0.0;
        auVar44._28_4_ = auVar102._28_4_;
        auVar91 = vfmsub231ps_fma(auVar44,auVar106,auVar116);
        auVar102 = vfmadd231ps_avx512vl(ZEXT1632(auVar91),auVar97,ZEXT1632(auVar92));
        auVar166._0_4_ = auVar116._0_4_ * auVar121._0_4_;
        auVar166._4_4_ = auVar116._4_4_ * auVar121._4_4_;
        auVar166._8_4_ = auVar116._8_4_ * auVar121._8_4_;
        auVar166._12_4_ = auVar116._12_4_ * auVar121._12_4_;
        auVar166._16_4_ = auVar116._16_4_ * fVar144;
        auVar166._20_4_ = auVar116._20_4_ * fVar165;
        auVar166._24_4_ = auVar116._24_4_ * fVar170;
        auVar166._28_4_ = 0;
        auVar92 = vfmsub231ps_fma(auVar166,auVar113,auVar115);
        auVar100 = vfmadd231ps_avx512vl(auVar102,auVar97,ZEXT1632(auVar92));
        auVar102 = vmulps_avx512vl(auVar105,auVar122);
        auVar102 = vfmsub231ps_avx512vl(auVar102,auVar114,auVar124);
        auVar45._4_4_ = auVar104._4_4_ * auVar124._4_4_;
        auVar45._0_4_ = auVar104._0_4_ * auVar124._0_4_;
        auVar45._8_4_ = auVar104._8_4_ * auVar124._8_4_;
        auVar45._12_4_ = auVar104._12_4_ * auVar124._12_4_;
        auVar45._16_4_ = auVar104._16_4_ * auVar124._16_4_;
        auVar45._20_4_ = auVar104._20_4_ * auVar124._20_4_;
        auVar45._24_4_ = auVar104._24_4_ * auVar124._24_4_;
        auVar45._28_4_ = auVar124._28_4_;
        auVar92 = vfmsub231ps_fma(auVar45,auVar123,auVar105);
        auVar167._0_4_ = auVar123._0_4_ * auVar114._0_4_;
        auVar167._4_4_ = auVar123._4_4_ * auVar114._4_4_;
        auVar167._8_4_ = auVar123._8_4_ * auVar114._8_4_;
        auVar167._12_4_ = auVar123._12_4_ * auVar114._12_4_;
        auVar167._16_4_ = fVar171 * auVar114._16_4_;
        auVar167._20_4_ = fVar155 * auVar114._20_4_;
        auVar167._24_4_ = fVar164 * auVar114._24_4_;
        auVar167._28_4_ = 0;
        auVar91 = vfmsub231ps_fma(auVar167,auVar104,auVar122);
        auVar102 = vfmadd231ps_avx512vl(ZEXT1632(auVar91),auVar97,auVar102);
        auVar107 = vfmadd231ps_avx512vl(auVar102,auVar97,ZEXT1632(auVar92));
        auVar102 = vmaxps_avx(auVar100,auVar107);
        uVar146 = vcmpps_avx512vl(auVar102,auVar97,2);
        local_310 = local_310 & (byte)uVar146;
        in_ZMM20 = ZEXT3264(local_520);
        auVar194 = ZEXT3264(local_4c0);
        auVar191 = ZEXT3264(local_5a0);
        auVar187 = ZEXT1664(local_630);
        if (local_310 == 0) {
          local_310 = 0;
          auVar175 = ZEXT3264(auVar101);
          auVar153 = ZEXT3264(auVar103);
        }
        else {
          auVar46._4_4_ = auVar105._4_4_ * auVar116._4_4_;
          auVar46._0_4_ = auVar105._0_4_ * auVar116._0_4_;
          auVar46._8_4_ = auVar105._8_4_ * auVar116._8_4_;
          auVar46._12_4_ = auVar105._12_4_ * auVar116._12_4_;
          auVar46._16_4_ = auVar105._16_4_ * auVar116._16_4_;
          auVar46._20_4_ = auVar105._20_4_ * auVar116._20_4_;
          auVar46._24_4_ = auVar105._24_4_ * auVar116._24_4_;
          auVar46._28_4_ = auVar102._28_4_;
          auVar196 = vfmsub231ps_fma(auVar46,auVar104,auVar115);
          auVar47._4_4_ = auVar115._4_4_ * auVar114._4_4_;
          auVar47._0_4_ = auVar115._0_4_ * auVar114._0_4_;
          auVar47._8_4_ = auVar115._8_4_ * auVar114._8_4_;
          auVar47._12_4_ = auVar115._12_4_ * auVar114._12_4_;
          auVar47._16_4_ = auVar115._16_4_ * auVar114._16_4_;
          auVar47._20_4_ = auVar115._20_4_ * auVar114._20_4_;
          auVar47._24_4_ = auVar115._24_4_ * auVar114._24_4_;
          auVar47._28_4_ = auVar115._28_4_;
          auVar91 = vfmsub231ps_fma(auVar47,auVar99,auVar105);
          auVar48._4_4_ = auVar104._4_4_ * auVar99._4_4_;
          auVar48._0_4_ = auVar104._0_4_ * auVar99._0_4_;
          auVar48._8_4_ = auVar104._8_4_ * auVar99._8_4_;
          auVar48._12_4_ = auVar104._12_4_ * auVar99._12_4_;
          auVar48._16_4_ = auVar104._16_4_ * auVar99._16_4_;
          auVar48._20_4_ = auVar104._20_4_ * auVar99._20_4_;
          auVar48._24_4_ = auVar104._24_4_ * auVar99._24_4_;
          auVar48._28_4_ = auVar104._28_4_;
          auVar8 = vfmsub231ps_fma(auVar48,auVar114,auVar116);
          auVar92 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar91),ZEXT1632(auVar8));
          auVar102 = vfmadd231ps_avx512vl(ZEXT1632(auVar92),ZEXT1632(auVar196),auVar97);
          auVar116 = vrcp14ps_avx512vl(auVar102);
          auVar184._8_4_ = 0x3f800000;
          auVar184._0_8_ = &DAT_3f8000003f800000;
          auVar184._12_4_ = 0x3f800000;
          auVar184._16_4_ = 0x3f800000;
          auVar184._20_4_ = 0x3f800000;
          auVar184._24_4_ = 0x3f800000;
          auVar184._28_4_ = 0x3f800000;
          auVar92 = vfnmadd213ps_fma(auVar116,auVar102,auVar184);
          auVar92 = vfmadd132ps_fma(ZEXT1632(auVar92),auVar116,auVar116);
          auVar49._4_4_ = auVar8._4_4_ * auVar121._4_4_;
          auVar49._0_4_ = auVar8._0_4_ * auVar121._0_4_;
          auVar49._8_4_ = auVar8._8_4_ * auVar121._8_4_;
          auVar49._12_4_ = auVar8._12_4_ * auVar121._12_4_;
          auVar49._16_4_ = fVar144 * 0.0;
          auVar49._20_4_ = fVar165 * 0.0;
          auVar49._24_4_ = fVar170 * 0.0;
          auVar49._28_4_ = iVar1;
          auVar91 = vfmadd231ps_fma(auVar49,auVar113,ZEXT1632(auVar91));
          auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar106,ZEXT1632(auVar196));
          fVar165 = auVar92._0_4_;
          fVar144 = auVar92._4_4_;
          fVar170 = auVar92._8_4_;
          fVar171 = auVar92._12_4_;
          auVar116 = ZEXT1632(CONCAT412(auVar91._12_4_ * fVar171,
                                        CONCAT48(auVar91._8_4_ * fVar170,
                                                 CONCAT44(auVar91._4_4_ * fVar144,
                                                          auVar91._0_4_ * fVar165))));
          auVar153 = ZEXT3264(auVar116);
          auVar178._4_4_ = uVar84;
          auVar178._0_4_ = uVar84;
          auVar178._8_4_ = uVar84;
          auVar178._12_4_ = uVar84;
          auVar178._16_4_ = uVar84;
          auVar178._20_4_ = uVar84;
          auVar178._24_4_ = uVar84;
          auVar178._28_4_ = uVar84;
          uVar146 = vcmpps_avx512vl(auVar178,auVar116,2);
          uVar145 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar25._4_4_ = uVar145;
          auVar25._0_4_ = uVar145;
          auVar25._8_4_ = uVar145;
          auVar25._12_4_ = uVar145;
          auVar25._16_4_ = uVar145;
          auVar25._20_4_ = uVar145;
          auVar25._24_4_ = uVar145;
          auVar25._28_4_ = uVar145;
          uVar23 = vcmpps_avx512vl(auVar116,auVar25,2);
          local_310 = (byte)uVar146 & (byte)uVar23 & local_310;
          if (local_310 == 0) {
            local_310 = 0;
            auVar175 = ZEXT3264(auVar101);
            auVar153 = ZEXT3264(auVar103);
          }
          else {
            uVar146 = vcmpps_avx512vl(auVar102,auVar97,4);
            if ((local_310 & (byte)uVar146) == 0) {
              local_310 = 0;
              auVar175 = ZEXT3264(auVar101);
              auVar153 = ZEXT3264(auVar103);
            }
            else {
              local_310 = local_310 & (byte)uVar146;
              fVar155 = auVar100._0_4_ * fVar165;
              fVar164 = auVar100._4_4_ * fVar144;
              auVar50._4_4_ = fVar164;
              auVar50._0_4_ = fVar155;
              fVar88 = auVar100._8_4_ * fVar170;
              auVar50._8_4_ = fVar88;
              fVar89 = auVar100._12_4_ * fVar171;
              auVar50._12_4_ = fVar89;
              fVar154 = auVar100._16_4_ * 0.0;
              auVar50._16_4_ = fVar154;
              fVar136 = auVar100._20_4_ * 0.0;
              auVar50._20_4_ = fVar136;
              fVar137 = auVar100._24_4_ * 0.0;
              auVar50._24_4_ = fVar137;
              auVar50._28_4_ = auVar100._28_4_;
              fVar165 = auVar107._0_4_ * fVar165;
              fVar144 = auVar107._4_4_ * fVar144;
              auVar51._4_4_ = fVar144;
              auVar51._0_4_ = fVar165;
              fVar170 = auVar107._8_4_ * fVar170;
              auVar51._8_4_ = fVar170;
              fVar171 = auVar107._12_4_ * fVar171;
              auVar51._12_4_ = fVar171;
              fVar138 = auVar107._16_4_ * 0.0;
              auVar51._16_4_ = fVar138;
              fVar140 = auVar107._20_4_ * 0.0;
              auVar51._20_4_ = fVar140;
              fVar141 = auVar107._24_4_ * 0.0;
              auVar51._24_4_ = fVar141;
              auVar51._28_4_ = auVar107._28_4_;
              auVar103 = vsubps_avx(auVar184,auVar50);
              bVar82 = (bool)((byte)(uVar87 >> 1) & 1);
              bVar15 = (bool)((byte)(uVar87 >> 2) & 1);
              bVar16 = (bool)((byte)(uVar87 >> 3) & 1);
              bVar17 = (bool)((byte)(uVar87 >> 4) & 1);
              bVar18 = (bool)((byte)(uVar87 >> 5) & 1);
              bVar19 = (bool)((byte)(uVar87 >> 6) & 1);
              bVar20 = SUB81(uVar87 >> 7,0);
              auVar175 = ZEXT3264(CONCAT428((uint)bVar20 * auVar100._28_4_ |
                                            (uint)!bVar20 * auVar103._28_4_,
                                            CONCAT424((uint)bVar19 * (int)fVar137 |
                                                      (uint)!bVar19 * auVar103._24_4_,
                                                      CONCAT420((uint)bVar18 * (int)fVar136 |
                                                                (uint)!bVar18 * auVar103._20_4_,
                                                                CONCAT416((uint)bVar17 *
                                                                          (int)fVar154 |
                                                                          (uint)!bVar17 *
                                                                          auVar103._16_4_,
                                                                          CONCAT412((uint)bVar16 *
                                                                                    (int)fVar89 |
                                                                                    (uint)!bVar16 *
                                                                                    auVar103._12_4_,
                                                                                    CONCAT48((uint)
                                                  bVar15 * (int)fVar88 |
                                                  (uint)!bVar15 * auVar103._8_4_,
                                                  CONCAT44((uint)bVar82 * (int)fVar164 |
                                                           (uint)!bVar82 * auVar103._4_4_,
                                                           (uint)(bVar80 & 1) * (int)fVar155 |
                                                           (uint)!(bool)(bVar80 & 1) *
                                                           auVar103._0_4_))))))));
              auVar103 = vsubps_avx(auVar184,auVar51);
              bVar82 = (bool)((byte)(uVar87 >> 1) & 1);
              bVar15 = (bool)((byte)(uVar87 >> 2) & 1);
              bVar16 = (bool)((byte)(uVar87 >> 3) & 1);
              bVar17 = (bool)((byte)(uVar87 >> 4) & 1);
              bVar18 = (bool)((byte)(uVar87 >> 5) & 1);
              bVar19 = (bool)((byte)(uVar87 >> 6) & 1);
              bVar20 = SUB81(uVar87 >> 7,0);
              local_240._4_4_ = (uint)bVar82 * (int)fVar144 | (uint)!bVar82 * auVar103._4_4_;
              local_240._0_4_ =
                   (uint)(bVar80 & 1) * (int)fVar165 | (uint)!(bool)(bVar80 & 1) * auVar103._0_4_;
              local_240._8_4_ = (uint)bVar15 * (int)fVar170 | (uint)!bVar15 * auVar103._8_4_;
              local_240._12_4_ = (uint)bVar16 * (int)fVar171 | (uint)!bVar16 * auVar103._12_4_;
              local_240._16_4_ = (uint)bVar17 * (int)fVar138 | (uint)!bVar17 * auVar103._16_4_;
              local_240._20_4_ = (uint)bVar18 * (int)fVar140 | (uint)!bVar18 * auVar103._20_4_;
              local_240._24_4_ = (uint)bVar19 * (int)fVar141 | (uint)!bVar19 * auVar103._24_4_;
              local_240._28_4_ = (uint)bVar20 * auVar107._28_4_ | (uint)!bVar20 * auVar103._28_4_;
            }
          }
        }
        auVar193 = ZEXT3264(local_540);
        if (local_310 != 0) {
          auVar103 = vsubps_avx(ZEXT1632(auVar195),auVar110);
          auVar102 = auVar175._0_32_;
          auVar92 = vfmadd213ps_fma(auVar103,auVar102,auVar110);
          uVar145 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x10);
          auVar26._4_4_ = uVar145;
          auVar26._0_4_ = uVar145;
          auVar26._8_4_ = uVar145;
          auVar26._12_4_ = uVar145;
          auVar26._16_4_ = uVar145;
          auVar26._20_4_ = uVar145;
          auVar26._24_4_ = uVar145;
          auVar26._28_4_ = uVar145;
          auVar103 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar92._12_4_ + auVar92._12_4_,
                                                        CONCAT48(auVar92._8_4_ + auVar92._8_4_,
                                                                 CONCAT44(auVar92._4_4_ +
                                                                          auVar92._4_4_,
                                                                          auVar92._0_4_ +
                                                                          auVar92._0_4_)))),auVar26)
          ;
          auVar101 = auVar153._0_32_;
          uVar146 = vcmpps_avx512vl(auVar101,auVar103,6);
          local_310 = local_310 & (byte)uVar146;
          if (local_310 != 0) {
            auVar149._8_4_ = 0xbf800000;
            auVar149._0_8_ = 0xbf800000bf800000;
            auVar149._12_4_ = 0xbf800000;
            auVar149._16_4_ = 0xbf800000;
            auVar149._20_4_ = 0xbf800000;
            auVar149._24_4_ = 0xbf800000;
            auVar149._28_4_ = 0xbf800000;
            auVar27._8_4_ = 0x40000000;
            auVar27._0_8_ = 0x4000000040000000;
            auVar27._12_4_ = 0x40000000;
            auVar27._16_4_ = 0x40000000;
            auVar27._20_4_ = 0x40000000;
            auVar27._24_4_ = 0x40000000;
            auVar27._28_4_ = 0x40000000;
            local_3a0 = vfmadd132ps_avx512vl(local_240,auVar149,auVar27);
            local_240 = local_3a0;
            auVar103 = local_240;
            local_360 = 0;
            if ((pGVar13->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (bVar82 = true, pGVar13->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                fVar165 = 1.0 / (float)local_5d0._0_4_;
                local_300[0] = fVar165 * (auVar175._0_4_ + 0.0);
                local_300[1] = fVar165 * (auVar175._4_4_ + 1.0);
                local_300[2] = fVar165 * (auVar175._8_4_ + 2.0);
                local_300[3] = fVar165 * (auVar175._12_4_ + 3.0);
                fStack_2f0 = fVar165 * (auVar175._16_4_ + 4.0);
                fStack_2ec = fVar165 * (auVar175._20_4_ + 5.0);
                fStack_2e8 = fVar165 * (auVar175._24_4_ + 6.0);
                fStack_2e4 = auVar175._28_4_ + 7.0;
                local_240._0_8_ = local_3a0._0_8_;
                local_240._8_8_ = local_3a0._8_8_;
                local_240._16_8_ = local_3a0._16_8_;
                local_240._24_8_ = local_3a0._24_8_;
                local_2e0 = local_240._0_8_;
                uStack_2d8 = local_240._8_8_;
                uStack_2d0 = local_240._16_8_;
                uStack_2c8 = local_240._24_8_;
                local_2c0 = auVar101;
                lVar86 = 0;
                uVar83 = (ulong)local_310;
                for (uVar87 = uVar83; (uVar87 & 1) == 0; uVar87 = uVar87 >> 1 | 0x8000000000000000)
                {
                  lVar86 = lVar86 + 1;
                }
                _local_2a0 = vpbroadcastd_avx512vl();
                local_600 = vpbroadcastd_avx512vl();
                local_610 = (undefined4)local_5c0;
                uStack_60c = (undefined4)((ulong)local_5c0 >> 0x20);
                bVar82 = true;
                local_620 = local_580;
                uStack_618 = uStack_578;
                uStack_608 = uStack_5b8;
                local_5f0 = *pauVar3;
                local_3c0 = auVar102;
                local_380 = auVar101;
                local_35c = iVar12;
                local_350 = auVar22;
                local_340 = local_5b0;
                uStack_338 = uStack_5a8;
                local_330 = local_5c0;
                uStack_328 = uStack_5b8;
                local_320 = local_580;
                uStack_318 = uStack_578;
                local_240 = auVar103;
                do {
                  auVar195 = auVar197._0_16_;
                  local_480 = (float)uVar83;
                  fStack_47c = (float)(uVar83 >> 0x20);
                  uVar145 = *(undefined4 *)(ray + k * 4 + 0x80);
                  fVar165 = local_300[lVar86];
                  local_420._4_4_ = fVar165;
                  local_420._0_4_ = fVar165;
                  local_420._8_4_ = fVar165;
                  local_420._12_4_ = fVar165;
                  local_280 = (uint)lVar86;
                  uStack_27c = (uint)((ulong)lVar86 >> 0x20);
                  local_410 = *(undefined4 *)((long)&local_2e0 + lVar86 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2c0 + lVar86 * 4);
                  local_660.context = context->user;
                  fVar144 = 1.0 - fVar165;
                  auVar8 = vfnmadd231ss_fma(ZEXT416((uint)(fVar165 * (fVar144 + fVar144))),
                                            ZEXT416((uint)fVar144),ZEXT416((uint)fVar144));
                  auVar92 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_420,
                                            ZEXT416(0xc0a00000));
                  auVar91 = vfmadd231ss_fma(ZEXT416((uint)(fVar165 * fVar165 * 3.0)),
                                            ZEXT416((uint)(fVar165 + fVar165)),auVar92);
                  auVar92 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_420,
                                            ZEXT416(0x40000000));
                  auVar92 = vfmadd231ss_fma(ZEXT416((uint)(fVar144 * fVar144 * -3.0)),
                                            ZEXT416((uint)(fVar144 + fVar144)),auVar92);
                  auVar196 = vfmadd231ss_fma(ZEXT416((uint)(fVar165 * fVar165)),local_420,
                                             ZEXT416((uint)(fVar144 * -2.0)));
                  fVar165 = auVar8._0_4_ * 0.5;
                  fVar144 = auVar91._0_4_ * 0.5;
                  fVar170 = auVar92._0_4_ * 0.5;
                  fVar171 = auVar196._0_4_ * 0.5;
                  auVar157._0_4_ = fVar171 * (float)local_620;
                  auVar157._4_4_ = fVar171 * local_620._4_4_;
                  auVar157._8_4_ = fVar171 * (float)uStack_618;
                  auVar157._12_4_ = fVar171 * uStack_618._4_4_;
                  auVar172._4_4_ = fVar170;
                  auVar172._0_4_ = fVar170;
                  auVar172._8_4_ = fVar170;
                  auVar172._12_4_ = fVar170;
                  auVar75._4_4_ = uStack_60c;
                  auVar75._0_4_ = local_610;
                  auVar75._8_8_ = uStack_608;
                  auVar92 = vfmadd132ps_fma(auVar172,auVar157,auVar75);
                  auVar158._4_4_ = fVar144;
                  auVar158._0_4_ = fVar144;
                  auVar158._8_4_ = fVar144;
                  auVar158._12_4_ = fVar144;
                  auVar92 = vfmadd132ps_fma(auVar158,auVar92,local_5f0);
                  auVar147._4_4_ = fVar165;
                  auVar147._0_4_ = fVar165;
                  auVar147._8_4_ = fVar165;
                  auVar147._12_4_ = fVar165;
                  auVar92 = vfmadd213ps_fma(auVar147,auVar22,auVar92);
                  local_450 = auVar92._0_4_;
                  local_440 = vshufps_avx(auVar92,auVar92,0x55);
                  local_430 = vshufps_avx(auVar92,auVar92,0xaa);
                  local_400 = local_600._0_8_;
                  uStack_3f8 = local_600._8_8_;
                  local_3f0 = _local_2a0;
                  vpcmpeqd_avx2(ZEXT1632(_local_2a0),ZEXT1632(_local_2a0));
                  uStack_3dc = (local_660.context)->instID[0];
                  local_3e0 = uStack_3dc;
                  uStack_3d8 = uStack_3dc;
                  uStack_3d4 = uStack_3dc;
                  uStack_3d0 = (local_660.context)->instPrimID[0];
                  uStack_3cc = uStack_3d0;
                  uStack_3c8 = uStack_3d0;
                  uStack_3c4 = uStack_3d0;
                  local_680 = local_490._0_8_;
                  uStack_678 = local_490._8_8_;
                  local_660.valid = (int *)&local_680;
                  local_660.geometryUserPtr = pGVar13->userPtr;
                  local_660.hit = (RTCHitN *)&local_450;
                  local_660.N = 4;
                  local_5e0._0_4_ = uVar145;
                  local_660.ray = (RTCRayN *)ray;
                  uStack_44c = local_450;
                  uStack_448 = local_450;
                  uStack_444 = local_450;
                  uStack_40c = local_410;
                  uStack_408 = local_410;
                  uStack_404 = local_410;
                  if (pGVar13->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar13->occlusionFilterN)(&local_660);
                    auVar187 = ZEXT1664(local_630);
                    auVar191 = ZEXT3264(local_5a0);
                    auVar192 = ZEXT3264(local_4e0);
                    auVar194 = ZEXT3264(local_4c0);
                    in_ZMM20 = ZEXT3264(local_520);
                    auVar92 = vxorps_avx512vl(auVar195,auVar195);
                    auVar197 = ZEXT1664(auVar92);
                    auVar193 = ZEXT3264(local_540);
                    uVar145 = local_5e0._0_4_;
                    uVar84 = local_560._0_4_;
                  }
                  auVar92 = auVar197._0_16_;
                  auVar71._8_8_ = uStack_678;
                  auVar71._0_8_ = local_680;
                  uVar87 = vptestmd_avx512vl(auVar71,auVar71);
                  if ((uVar87 & 0xf) == 0) {
                    uVar83 = CONCAT44(fStack_47c,local_480);
                  }
                  else {
                    p_Var14 = context->args->filter;
                    if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar13->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var14)(&local_660);
                      auVar187 = ZEXT1664(local_630);
                      auVar191 = ZEXT3264(local_5a0);
                      auVar192 = ZEXT3264(local_4e0);
                      auVar194 = ZEXT3264(local_4c0);
                      in_ZMM20 = ZEXT3264(local_520);
                      auVar92 = vxorps_avx512vl(auVar92,auVar92);
                      auVar197 = ZEXT1664(auVar92);
                      auVar193 = ZEXT3264(local_540);
                      uVar84 = local_560._0_4_;
                      uVar145 = local_5e0._0_4_;
                    }
                    auVar72._8_8_ = uStack_678;
                    auVar72._0_8_ = local_680;
                    auVar92 = *(undefined1 (*) [16])(local_660.ray + 0x80);
                    uVar87 = vptestmd_avx512vl(auVar72,auVar72);
                    uVar87 = uVar87 & 0xf;
                    auVar91 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                    bVar15 = (bool)((byte)uVar87 & 1);
                    auVar95._0_4_ = (uint)bVar15 * auVar91._0_4_ | (uint)!bVar15 * auVar92._0_4_;
                    bVar15 = (bool)((byte)(uVar87 >> 1) & 1);
                    auVar95._4_4_ = (uint)bVar15 * auVar91._4_4_ | (uint)!bVar15 * auVar92._4_4_;
                    bVar15 = (bool)((byte)(uVar87 >> 2) & 1);
                    auVar95._8_4_ = (uint)bVar15 * auVar91._8_4_ | (uint)!bVar15 * auVar92._8_4_;
                    bVar15 = SUB81(uVar87 >> 3,0);
                    auVar95._12_4_ = (uint)bVar15 * auVar91._12_4_ | (uint)!bVar15 * auVar92._12_4_;
                    *(undefined1 (*) [16])(local_660.ray + 0x80) = auVar95;
                    uVar83 = CONCAT44(fStack_47c,local_480);
                    local_480 = auVar187._0_4_;
                    if ((byte)uVar87 != 0) break;
                  }
                  *(undefined4 *)(ray + k * 4 + 0x80) = uVar145;
                  lVar86 = 0;
                  uVar83 = uVar83 ^ 1L << ((ulong)local_280 & 0x3f);
                  for (uVar87 = uVar83; (uVar87 & 1) == 0; uVar87 = uVar87 >> 1 | 0x8000000000000000
                      ) {
                    lVar86 = lVar86 + 1;
                  }
                  bVar82 = uVar83 != 0;
                  local_480 = auVar187._0_4_;
                } while (bVar82);
                auVar175 = ZEXT3264(auVar102);
                auVar153 = ZEXT3264(auVar101);
              }
              goto LAB_01dc272a;
            }
          }
        }
        bVar82 = false;
      }
LAB_01dc272a:
      local_540 = auVar193._0_32_;
      if (8 < iVar12) {
        local_560 = vpbroadcastd_avx512vl();
        local_280 = uVar84;
        uStack_27c = uVar84;
        uStack_278 = uVar84;
        uStack_274 = uVar84;
        uStack_270 = uVar84;
        uStack_26c = uVar84;
        uStack_268 = uVar84;
        uStack_264 = uVar84;
        local_2a0._4_4_ = 1.0 / (float)local_5d0._0_4_;
        local_2a0._0_4_ = local_2a0._4_4_;
        fStack_298 = (float)local_2a0._4_4_;
        fStack_294 = (float)local_2a0._4_4_;
        fStack_290 = (float)local_2a0._4_4_;
        fStack_28c = (float)local_2a0._4_4_;
        fStack_288 = (float)local_2a0._4_4_;
        fStack_284 = (float)local_2a0._4_4_;
        local_5d0 = vpbroadcastd_avx512vl();
        local_5e0 = vpbroadcastd_avx512vl();
        lVar86 = 8;
        auVar101 = auVar175._0_32_;
        auVar103 = auVar153._0_32_;
        fStack_47c = local_480;
        fStack_478 = local_480;
        fStack_474 = local_480;
        fStack_470 = local_480;
        fStack_46c = local_480;
        fStack_468 = local_480;
        fStack_464 = local_480;
        do {
          auVar102 = vpbroadcastd_avx512vl();
          auVar104 = vpor_avx2(auVar102,_DAT_0205a920);
          uVar23 = vpcmpd_avx512vl(auVar104,local_560,1);
          auVar102 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar86 * 4 + lVar24);
          auVar116 = *(undefined1 (*) [32])(lVar24 + 0x22307f0 + lVar86 * 4);
          auVar115 = *(undefined1 (*) [32])(lVar24 + 0x2230c74 + lVar86 * 4);
          auVar114 = *(undefined1 (*) [32])(lVar24 + 0x22310f8 + lVar86 * 4);
          auVar105 = vmulps_avx512vl(local_140,auVar114);
          auVar106 = vmulps_avx512vl(local_160,auVar114);
          auVar52._4_4_ = auVar114._4_4_ * (float)local_180._4_4_;
          auVar52._0_4_ = auVar114._0_4_ * (float)local_180._0_4_;
          auVar52._8_4_ = auVar114._8_4_ * fStack_178;
          auVar52._12_4_ = auVar114._12_4_ * fStack_174;
          auVar52._16_4_ = auVar114._16_4_ * fStack_170;
          auVar52._20_4_ = auVar114._20_4_ * fStack_16c;
          auVar52._24_4_ = auVar114._24_4_ * fStack_168;
          auVar52._28_4_ = auVar104._28_4_;
          auVar104 = vfmadd231ps_avx512vl(auVar105,auVar115,local_e0);
          auVar105 = vfmadd231ps_avx512vl(auVar106,auVar115,local_100);
          auVar106 = vfmadd231ps_avx512vl(auVar52,auVar115,local_120);
          auVar112 = auVar191._0_32_;
          auVar104 = vfmadd231ps_avx512vl(auVar104,auVar116,auVar112);
          auVar105 = vfmadd231ps_avx512vl(auVar105,auVar116,local_200);
          auVar92 = vfmadd231ps_fma(auVar106,auVar116,local_c0);
          auVar185 = auVar194._0_32_;
          auVar107 = vfmadd231ps_avx512vl(auVar104,auVar102,auVar185);
          auVar177 = auVar192._0_32_;
          auVar97 = vfmadd231ps_avx512vl(auVar105,auVar102,auVar177);
          auVar104 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar86 * 4 + lVar24);
          auVar105 = *(undefined1 (*) [32])(lVar24 + 0x2232c10 + lVar86 * 4);
          auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar102,local_a0);
          auVar106 = *(undefined1 (*) [32])(lVar24 + 0x2233094 + lVar86 * 4);
          auVar113 = *(undefined1 (*) [32])(lVar24 + 0x2233518 + lVar86 * 4);
          auVar99 = vmulps_avx512vl(local_140,auVar113);
          auVar100 = vmulps_avx512vl(local_160,auVar113);
          auVar53._4_4_ = auVar113._4_4_ * (float)local_180._4_4_;
          auVar53._0_4_ = auVar113._0_4_ * (float)local_180._0_4_;
          auVar53._8_4_ = auVar113._8_4_ * fStack_178;
          auVar53._12_4_ = auVar113._12_4_ * fStack_174;
          auVar53._16_4_ = auVar113._16_4_ * fStack_170;
          auVar53._20_4_ = auVar113._20_4_ * fStack_16c;
          auVar53._24_4_ = auVar113._24_4_ * fStack_168;
          auVar53._28_4_ = uStack_164;
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar106,local_e0);
          auVar100 = vfmadd231ps_avx512vl(auVar100,auVar106,local_100);
          auVar98 = vfmadd231ps_avx512vl(auVar53,auVar106,local_120);
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar105,auVar112);
          auVar100 = vfmadd231ps_avx512vl(auVar100,auVar105,local_200);
          auVar91 = vfmadd231ps_fma(auVar98,auVar105,local_c0);
          auVar98 = vfmadd231ps_avx512vl(auVar99,auVar104,auVar185);
          auVar108 = vfmadd231ps_avx512vl(auVar100,auVar104,auVar177);
          auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar104,local_a0);
          auVar109 = vmaxps_avx512vl(ZEXT1632(auVar92),ZEXT1632(auVar91));
          auVar99 = vsubps_avx(auVar98,auVar107);
          auVar100 = vsubps_avx(auVar108,auVar97);
          auVar110 = vmulps_avx512vl(auVar97,auVar99);
          auVar111 = vmulps_avx512vl(auVar107,auVar100);
          auVar110 = vsubps_avx512vl(auVar110,auVar111);
          auVar111 = vmulps_avx512vl(auVar100,auVar100);
          auVar111 = vfmadd231ps_avx512vl(auVar111,auVar99,auVar99);
          auVar109 = vmulps_avx512vl(auVar109,auVar109);
          auVar109 = vmulps_avx512vl(auVar109,auVar111);
          auVar110 = vmulps_avx512vl(auVar110,auVar110);
          uVar146 = vcmpps_avx512vl(auVar110,auVar109,2);
          local_310 = (byte)uVar23 & (byte)uVar146;
          if (local_310 == 0) {
            auVar187 = ZEXT3264(auVar177);
            auVar191 = ZEXT3264(auVar112);
          }
          else {
            auVar113 = vmulps_avx512vl(local_500,auVar113);
            auVar106 = vfmadd213ps_avx512vl(auVar106,local_1e0,auVar113);
            auVar105 = vfmadd213ps_avx512vl(auVar105,local_1c0,auVar106);
            auVar104 = vfmadd213ps_avx512vl(auVar104,local_1a0,auVar105);
            auVar114 = vmulps_avx512vl(local_500,auVar114);
            auVar115 = vfmadd213ps_avx512vl(auVar115,local_1e0,auVar114);
            auVar116 = vfmadd213ps_avx512vl(auVar116,local_1c0,auVar115);
            auVar105 = vfmadd213ps_avx512vl(auVar102,local_1a0,auVar116);
            auVar102 = *(undefined1 (*) [32])(lVar24 + 0x223157c + lVar86 * 4);
            auVar116 = *(undefined1 (*) [32])(lVar24 + 0x2231a00 + lVar86 * 4);
            auVar115 = *(undefined1 (*) [32])(lVar24 + 0x2231e84 + lVar86 * 4);
            auVar114 = *(undefined1 (*) [32])(lVar24 + 0x2232308 + lVar86 * 4);
            auVar106 = vmulps_avx512vl(local_140,auVar114);
            auVar113 = vmulps_avx512vl(local_160,auVar114);
            auVar114 = vmulps_avx512vl(local_500,auVar114);
            auVar106 = vfmadd231ps_avx512vl(auVar106,auVar115,local_e0);
            auVar113 = vfmadd231ps_avx512vl(auVar113,auVar115,local_100);
            auVar115 = vfmadd231ps_avx512vl(auVar114,local_1e0,auVar115);
            auVar114 = vfmadd231ps_avx512vl(auVar106,auVar116,auVar112);
            auVar106 = vfmadd231ps_avx512vl(auVar113,auVar116,local_200);
            auVar116 = vfmadd231ps_avx512vl(auVar115,local_1c0,auVar116);
            auVar114 = vfmadd231ps_avx512vl(auVar114,auVar102,auVar185);
            auVar106 = vfmadd231ps_avx512vl(auVar106,auVar102,auVar177);
            auVar113 = vfmadd231ps_avx512vl(auVar116,local_1a0,auVar102);
            auVar102 = *(undefined1 (*) [32])(lVar24 + 0x223399c + lVar86 * 4);
            auVar116 = *(undefined1 (*) [32])(lVar24 + 0x22342a4 + lVar86 * 4);
            auVar115 = *(undefined1 (*) [32])(lVar24 + 0x2234728 + lVar86 * 4);
            auVar109 = vmulps_avx512vl(local_140,auVar115);
            auVar110 = vmulps_avx512vl(local_160,auVar115);
            auVar115 = vmulps_avx512vl(local_500,auVar115);
            auVar109 = vfmadd231ps_avx512vl(auVar109,auVar116,local_e0);
            auVar110 = vfmadd231ps_avx512vl(auVar110,auVar116,local_100);
            auVar115 = vfmadd231ps_avx512vl(auVar115,local_1e0,auVar116);
            auVar116 = *(undefined1 (*) [32])(lVar24 + 0x2233e20 + lVar86 * 4);
            auVar109 = vfmadd231ps_avx512vl(auVar109,auVar116,auVar112);
            auVar196 = vfmadd231ps_fma(auVar110,auVar116,local_200);
            auVar116 = vfmadd231ps_avx512vl(auVar115,local_1c0,auVar116);
            auVar115 = vfmadd231ps_avx512vl(auVar109,auVar102,auVar185);
            auVar109 = vfmadd231ps_avx512vl(ZEXT1632(auVar196),auVar102,auVar177);
            auVar116 = vfmadd231ps_avx512vl(auVar116,local_1a0,auVar102);
            auVar110 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar114,auVar110);
            vandps_avx512vl(auVar106,auVar110);
            auVar102 = vmaxps_avx(auVar110,auVar110);
            vandps_avx512vl(auVar113,auVar110);
            auVar102 = vmaxps_avx(auVar102,auVar110);
            auVar76._4_4_ = fStack_47c;
            auVar76._0_4_ = local_480;
            auVar76._8_4_ = fStack_478;
            auVar76._12_4_ = fStack_474;
            auVar76._16_4_ = fStack_470;
            auVar76._20_4_ = fStack_46c;
            auVar76._24_4_ = fStack_468;
            auVar76._28_4_ = fStack_464;
            uVar87 = vcmpps_avx512vl(auVar102,auVar76,1);
            bVar15 = (bool)((byte)uVar87 & 1);
            auVar127._0_4_ = (float)((uint)bVar15 * auVar99._0_4_ | (uint)!bVar15 * auVar114._0_4_);
            bVar15 = (bool)((byte)(uVar87 >> 1) & 1);
            auVar127._4_4_ = (float)((uint)bVar15 * auVar99._4_4_ | (uint)!bVar15 * auVar114._4_4_);
            bVar15 = (bool)((byte)(uVar87 >> 2) & 1);
            auVar127._8_4_ = (float)((uint)bVar15 * auVar99._8_4_ | (uint)!bVar15 * auVar114._8_4_);
            bVar15 = (bool)((byte)(uVar87 >> 3) & 1);
            auVar127._12_4_ =
                 (float)((uint)bVar15 * auVar99._12_4_ | (uint)!bVar15 * auVar114._12_4_);
            bVar15 = (bool)((byte)(uVar87 >> 4) & 1);
            auVar127._16_4_ =
                 (float)((uint)bVar15 * auVar99._16_4_ | (uint)!bVar15 * auVar114._16_4_);
            bVar15 = (bool)((byte)(uVar87 >> 5) & 1);
            auVar127._20_4_ =
                 (float)((uint)bVar15 * auVar99._20_4_ | (uint)!bVar15 * auVar114._20_4_);
            bVar15 = (bool)((byte)(uVar87 >> 6) & 1);
            auVar127._24_4_ =
                 (float)((uint)bVar15 * auVar99._24_4_ | (uint)!bVar15 * auVar114._24_4_);
            bVar15 = SUB81(uVar87 >> 7,0);
            auVar127._28_4_ = (uint)bVar15 * auVar99._28_4_ | (uint)!bVar15 * auVar114._28_4_;
            bVar15 = (bool)((byte)uVar87 & 1);
            auVar128._0_4_ = (float)((uint)bVar15 * auVar100._0_4_ | (uint)!bVar15 * auVar106._0_4_)
            ;
            bVar15 = (bool)((byte)(uVar87 >> 1) & 1);
            auVar128._4_4_ = (float)((uint)bVar15 * auVar100._4_4_ | (uint)!bVar15 * auVar106._4_4_)
            ;
            bVar15 = (bool)((byte)(uVar87 >> 2) & 1);
            auVar128._8_4_ = (float)((uint)bVar15 * auVar100._8_4_ | (uint)!bVar15 * auVar106._8_4_)
            ;
            bVar15 = (bool)((byte)(uVar87 >> 3) & 1);
            auVar128._12_4_ =
                 (float)((uint)bVar15 * auVar100._12_4_ | (uint)!bVar15 * auVar106._12_4_);
            bVar15 = (bool)((byte)(uVar87 >> 4) & 1);
            auVar128._16_4_ =
                 (float)((uint)bVar15 * auVar100._16_4_ | (uint)!bVar15 * auVar106._16_4_);
            bVar15 = (bool)((byte)(uVar87 >> 5) & 1);
            auVar128._20_4_ =
                 (float)((uint)bVar15 * auVar100._20_4_ | (uint)!bVar15 * auVar106._20_4_);
            bVar15 = (bool)((byte)(uVar87 >> 6) & 1);
            auVar128._24_4_ =
                 (float)((uint)bVar15 * auVar100._24_4_ | (uint)!bVar15 * auVar106._24_4_);
            bVar15 = SUB81(uVar87 >> 7,0);
            auVar128._28_4_ = (uint)bVar15 * auVar100._28_4_ | (uint)!bVar15 * auVar106._28_4_;
            vandps_avx512vl(auVar115,auVar110);
            vandps_avx512vl(auVar109,auVar110);
            auVar102 = vmaxps_avx(auVar128,auVar128);
            vandps_avx512vl(auVar116,auVar110);
            auVar102 = vmaxps_avx(auVar102,auVar128);
            uVar87 = vcmpps_avx512vl(auVar102,auVar76,1);
            bVar15 = (bool)((byte)uVar87 & 1);
            auVar129._0_4_ = (uint)bVar15 * auVar99._0_4_ | (uint)!bVar15 * auVar115._0_4_;
            bVar15 = (bool)((byte)(uVar87 >> 1) & 1);
            auVar129._4_4_ = (uint)bVar15 * auVar99._4_4_ | (uint)!bVar15 * auVar115._4_4_;
            bVar15 = (bool)((byte)(uVar87 >> 2) & 1);
            auVar129._8_4_ = (uint)bVar15 * auVar99._8_4_ | (uint)!bVar15 * auVar115._8_4_;
            bVar15 = (bool)((byte)(uVar87 >> 3) & 1);
            auVar129._12_4_ = (uint)bVar15 * auVar99._12_4_ | (uint)!bVar15 * auVar115._12_4_;
            bVar15 = (bool)((byte)(uVar87 >> 4) & 1);
            auVar129._16_4_ = (uint)bVar15 * auVar99._16_4_ | (uint)!bVar15 * auVar115._16_4_;
            bVar15 = (bool)((byte)(uVar87 >> 5) & 1);
            auVar129._20_4_ = (uint)bVar15 * auVar99._20_4_ | (uint)!bVar15 * auVar115._20_4_;
            bVar15 = (bool)((byte)(uVar87 >> 6) & 1);
            auVar129._24_4_ = (uint)bVar15 * auVar99._24_4_ | (uint)!bVar15 * auVar115._24_4_;
            bVar15 = SUB81(uVar87 >> 7,0);
            auVar129._28_4_ = (uint)bVar15 * auVar99._28_4_ | (uint)!bVar15 * auVar115._28_4_;
            bVar15 = (bool)((byte)uVar87 & 1);
            auVar130._0_4_ = (float)((uint)bVar15 * auVar100._0_4_ | (uint)!bVar15 * auVar109._0_4_)
            ;
            bVar15 = (bool)((byte)(uVar87 >> 1) & 1);
            auVar130._4_4_ = (float)((uint)bVar15 * auVar100._4_4_ | (uint)!bVar15 * auVar109._4_4_)
            ;
            bVar15 = (bool)((byte)(uVar87 >> 2) & 1);
            auVar130._8_4_ = (float)((uint)bVar15 * auVar100._8_4_ | (uint)!bVar15 * auVar109._8_4_)
            ;
            bVar15 = (bool)((byte)(uVar87 >> 3) & 1);
            auVar130._12_4_ =
                 (float)((uint)bVar15 * auVar100._12_4_ | (uint)!bVar15 * auVar109._12_4_);
            bVar15 = (bool)((byte)(uVar87 >> 4) & 1);
            auVar130._16_4_ =
                 (float)((uint)bVar15 * auVar100._16_4_ | (uint)!bVar15 * auVar109._16_4_);
            bVar15 = (bool)((byte)(uVar87 >> 5) & 1);
            auVar130._20_4_ =
                 (float)((uint)bVar15 * auVar100._20_4_ | (uint)!bVar15 * auVar109._20_4_);
            bVar15 = (bool)((byte)(uVar87 >> 6) & 1);
            auVar130._24_4_ =
                 (float)((uint)bVar15 * auVar100._24_4_ | (uint)!bVar15 * auVar109._24_4_);
            bVar15 = SUB81(uVar87 >> 7,0);
            auVar130._28_4_ = (uint)bVar15 * auVar100._28_4_ | (uint)!bVar15 * auVar109._28_4_;
            auVar180._8_4_ = 0x80000000;
            auVar180._0_8_ = 0x8000000080000000;
            auVar180._12_4_ = 0x80000000;
            auVar180._16_4_ = 0x80000000;
            auVar180._20_4_ = 0x80000000;
            auVar180._24_4_ = 0x80000000;
            auVar180._28_4_ = 0x80000000;
            auVar102 = vxorps_avx512vl(auVar129,auVar180);
            auVar109 = auVar197._0_32_;
            auVar116 = vfmadd213ps_avx512vl(auVar127,auVar127,auVar109);
            auVar196 = vfmadd231ps_fma(auVar116,auVar128,auVar128);
            auVar116 = vrsqrt14ps_avx512vl(ZEXT1632(auVar196));
            auVar190._8_4_ = 0xbf000000;
            auVar190._0_8_ = 0xbf000000bf000000;
            auVar190._12_4_ = 0xbf000000;
            auVar190._16_4_ = 0xbf000000;
            auVar190._20_4_ = 0xbf000000;
            auVar190._24_4_ = 0xbf000000;
            auVar190._28_4_ = 0xbf000000;
            fVar165 = auVar116._0_4_;
            fVar144 = auVar116._4_4_;
            fVar170 = auVar116._8_4_;
            fVar171 = auVar116._12_4_;
            fVar155 = auVar116._16_4_;
            fVar164 = auVar116._20_4_;
            fVar88 = auVar116._24_4_;
            auVar54._4_4_ = fVar144 * fVar144 * fVar144 * auVar196._4_4_ * -0.5;
            auVar54._0_4_ = fVar165 * fVar165 * fVar165 * auVar196._0_4_ * -0.5;
            auVar54._8_4_ = fVar170 * fVar170 * fVar170 * auVar196._8_4_ * -0.5;
            auVar54._12_4_ = fVar171 * fVar171 * fVar171 * auVar196._12_4_ * -0.5;
            auVar54._16_4_ = fVar155 * fVar155 * fVar155 * -0.0;
            auVar54._20_4_ = fVar164 * fVar164 * fVar164 * -0.0;
            auVar54._24_4_ = fVar88 * fVar88 * fVar88 * -0.0;
            auVar54._28_4_ = auVar128._28_4_;
            auVar115 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar116 = vfmadd231ps_avx512vl(auVar54,auVar115,auVar116);
            auVar55._4_4_ = auVar128._4_4_ * auVar116._4_4_;
            auVar55._0_4_ = auVar128._0_4_ * auVar116._0_4_;
            auVar55._8_4_ = auVar128._8_4_ * auVar116._8_4_;
            auVar55._12_4_ = auVar128._12_4_ * auVar116._12_4_;
            auVar55._16_4_ = auVar128._16_4_ * auVar116._16_4_;
            auVar55._20_4_ = auVar128._20_4_ * auVar116._20_4_;
            auVar55._24_4_ = auVar128._24_4_ * auVar116._24_4_;
            auVar55._28_4_ = 0;
            auVar56._4_4_ = auVar116._4_4_ * -auVar127._4_4_;
            auVar56._0_4_ = auVar116._0_4_ * -auVar127._0_4_;
            auVar56._8_4_ = auVar116._8_4_ * -auVar127._8_4_;
            auVar56._12_4_ = auVar116._12_4_ * -auVar127._12_4_;
            auVar56._16_4_ = auVar116._16_4_ * -auVar127._16_4_;
            auVar56._20_4_ = auVar116._20_4_ * -auVar127._20_4_;
            auVar56._24_4_ = auVar116._24_4_ * -auVar127._24_4_;
            auVar56._28_4_ = auVar128._28_4_;
            auVar114 = vmulps_avx512vl(auVar116,auVar109);
            auVar116 = vfmadd213ps_avx512vl(auVar129,auVar129,auVar109);
            auVar116 = vfmadd231ps_avx512vl(auVar116,auVar130,auVar130);
            auVar106 = vrsqrt14ps_avx512vl(auVar116);
            auVar116 = vmulps_avx512vl(auVar116,auVar190);
            fVar165 = auVar106._0_4_;
            fVar144 = auVar106._4_4_;
            fVar170 = auVar106._8_4_;
            fVar171 = auVar106._12_4_;
            fVar155 = auVar106._16_4_;
            fVar164 = auVar106._20_4_;
            fVar88 = auVar106._24_4_;
            auVar57._4_4_ = fVar144 * fVar144 * fVar144 * auVar116._4_4_;
            auVar57._0_4_ = fVar165 * fVar165 * fVar165 * auVar116._0_4_;
            auVar57._8_4_ = fVar170 * fVar170 * fVar170 * auVar116._8_4_;
            auVar57._12_4_ = fVar171 * fVar171 * fVar171 * auVar116._12_4_;
            auVar57._16_4_ = fVar155 * fVar155 * fVar155 * auVar116._16_4_;
            auVar57._20_4_ = fVar164 * fVar164 * fVar164 * auVar116._20_4_;
            auVar57._24_4_ = fVar88 * fVar88 * fVar88 * auVar116._24_4_;
            auVar57._28_4_ = auVar116._28_4_;
            auVar116 = vfmadd231ps_avx512vl(auVar57,auVar115,auVar106);
            auVar58._4_4_ = auVar130._4_4_ * auVar116._4_4_;
            auVar58._0_4_ = auVar130._0_4_ * auVar116._0_4_;
            auVar58._8_4_ = auVar130._8_4_ * auVar116._8_4_;
            auVar58._12_4_ = auVar130._12_4_ * auVar116._12_4_;
            auVar58._16_4_ = auVar130._16_4_ * auVar116._16_4_;
            auVar58._20_4_ = auVar130._20_4_ * auVar116._20_4_;
            auVar58._24_4_ = auVar130._24_4_ * auVar116._24_4_;
            auVar58._28_4_ = auVar106._28_4_;
            auVar59._4_4_ = auVar116._4_4_ * auVar102._4_4_;
            auVar59._0_4_ = auVar116._0_4_ * auVar102._0_4_;
            auVar59._8_4_ = auVar116._8_4_ * auVar102._8_4_;
            auVar59._12_4_ = auVar116._12_4_ * auVar102._12_4_;
            auVar59._16_4_ = auVar116._16_4_ * auVar102._16_4_;
            auVar59._20_4_ = auVar116._20_4_ * auVar102._20_4_;
            auVar59._24_4_ = auVar116._24_4_ * auVar102._24_4_;
            auVar59._28_4_ = auVar102._28_4_;
            auVar102 = vmulps_avx512vl(auVar116,auVar109);
            auVar196 = vfmadd213ps_fma(auVar55,ZEXT1632(auVar92),auVar107);
            auVar116 = ZEXT1632(auVar92);
            auVar8 = vfmadd213ps_fma(auVar56,auVar116,auVar97);
            auVar115 = vfmadd213ps_avx512vl(auVar114,auVar116,auVar105);
            auVar106 = vfmadd213ps_avx512vl(auVar58,ZEXT1632(auVar91),auVar98);
            auVar152 = vfnmadd213ps_fma(auVar55,auVar116,auVar107);
            auVar113 = ZEXT1632(auVar91);
            auVar195 = vfmadd213ps_fma(auVar59,auVar113,auVar108);
            auVar93 = vfnmadd213ps_fma(auVar56,auVar116,auVar97);
            auVar90 = vfmadd213ps_fma(auVar102,auVar113,auVar104);
            auVar97 = ZEXT1632(auVar92);
            auVar94 = vfnmadd231ps_fma(auVar105,auVar97,auVar114);
            auVar156 = vfnmadd213ps_fma(auVar58,auVar113,auVar98);
            auVar176 = vfnmadd213ps_fma(auVar59,auVar113,auVar108);
            auVar179 = vfnmadd231ps_fma(auVar104,ZEXT1632(auVar91),auVar102);
            auVar104 = vsubps_avx512vl(auVar106,ZEXT1632(auVar152));
            auVar102 = vsubps_avx(ZEXT1632(auVar195),ZEXT1632(auVar93));
            auVar116 = vsubps_avx(ZEXT1632(auVar90),ZEXT1632(auVar94));
            auVar60._4_4_ = auVar102._4_4_ * auVar94._4_4_;
            auVar60._0_4_ = auVar102._0_4_ * auVar94._0_4_;
            auVar60._8_4_ = auVar102._8_4_ * auVar94._8_4_;
            auVar60._12_4_ = auVar102._12_4_ * auVar94._12_4_;
            auVar60._16_4_ = auVar102._16_4_ * 0.0;
            auVar60._20_4_ = auVar102._20_4_ * 0.0;
            auVar60._24_4_ = auVar102._24_4_ * 0.0;
            auVar60._28_4_ = auVar114._28_4_;
            auVar92 = vfmsub231ps_fma(auVar60,ZEXT1632(auVar93),auVar116);
            auVar61._4_4_ = auVar116._4_4_ * auVar152._4_4_;
            auVar61._0_4_ = auVar116._0_4_ * auVar152._0_4_;
            auVar61._8_4_ = auVar116._8_4_ * auVar152._8_4_;
            auVar61._12_4_ = auVar116._12_4_ * auVar152._12_4_;
            auVar61._16_4_ = auVar116._16_4_ * 0.0;
            auVar61._20_4_ = auVar116._20_4_ * 0.0;
            auVar61._24_4_ = auVar116._24_4_ * 0.0;
            auVar61._28_4_ = auVar116._28_4_;
            auVar9 = vfmsub231ps_fma(auVar61,ZEXT1632(auVar94),auVar104);
            auVar62._4_4_ = auVar93._4_4_ * auVar104._4_4_;
            auVar62._0_4_ = auVar93._0_4_ * auVar104._0_4_;
            auVar62._8_4_ = auVar93._8_4_ * auVar104._8_4_;
            auVar62._12_4_ = auVar93._12_4_ * auVar104._12_4_;
            auVar62._16_4_ = auVar104._16_4_ * 0.0;
            auVar62._20_4_ = auVar104._20_4_ * 0.0;
            auVar62._24_4_ = auVar104._24_4_ * 0.0;
            auVar62._28_4_ = auVar104._28_4_;
            auVar10 = vfmsub231ps_fma(auVar62,ZEXT1632(auVar152),auVar102);
            auVar102 = vfmadd231ps_avx512vl(ZEXT1632(auVar10),auVar109,ZEXT1632(auVar9));
            auVar102 = vfmadd231ps_avx512vl(auVar102,auVar109,ZEXT1632(auVar92));
            uVar87 = vcmpps_avx512vl(auVar102,auVar109,2);
            bVar80 = (byte)uVar87;
            fVar136 = (float)((uint)(bVar80 & 1) * auVar196._0_4_ |
                             (uint)!(bool)(bVar80 & 1) * auVar156._0_4_);
            bVar15 = (bool)((byte)(uVar87 >> 1) & 1);
            fVar138 = (float)((uint)bVar15 * auVar196._4_4_ | (uint)!bVar15 * auVar156._4_4_);
            bVar15 = (bool)((byte)(uVar87 >> 2) & 1);
            fVar141 = (float)((uint)bVar15 * auVar196._8_4_ | (uint)!bVar15 * auVar156._8_4_);
            bVar15 = (bool)((byte)(uVar87 >> 3) & 1);
            fVar142 = (float)((uint)bVar15 * auVar196._12_4_ | (uint)!bVar15 * auVar156._12_4_);
            auVar113 = ZEXT1632(CONCAT412(fVar142,CONCAT48(fVar141,CONCAT44(fVar138,fVar136))));
            fVar137 = (float)((uint)(bVar80 & 1) * auVar8._0_4_ |
                             (uint)!(bool)(bVar80 & 1) * auVar176._0_4_);
            bVar15 = (bool)((byte)(uVar87 >> 1) & 1);
            fVar140 = (float)((uint)bVar15 * auVar8._4_4_ | (uint)!bVar15 * auVar176._4_4_);
            bVar15 = (bool)((byte)(uVar87 >> 2) & 1);
            fVar139 = (float)((uint)bVar15 * auVar8._8_4_ | (uint)!bVar15 * auVar176._8_4_);
            bVar15 = (bool)((byte)(uVar87 >> 3) & 1);
            fVar143 = (float)((uint)bVar15 * auVar8._12_4_ | (uint)!bVar15 * auVar176._12_4_);
            auVar99 = ZEXT1632(CONCAT412(fVar143,CONCAT48(fVar139,CONCAT44(fVar140,fVar137))));
            auVar131._0_4_ =
                 (float)((uint)(bVar80 & 1) * auVar115._0_4_ |
                        (uint)!(bool)(bVar80 & 1) * auVar179._0_4_);
            bVar15 = (bool)((byte)(uVar87 >> 1) & 1);
            auVar131._4_4_ = (float)((uint)bVar15 * auVar115._4_4_ | (uint)!bVar15 * auVar179._4_4_)
            ;
            bVar15 = (bool)((byte)(uVar87 >> 2) & 1);
            auVar131._8_4_ = (float)((uint)bVar15 * auVar115._8_4_ | (uint)!bVar15 * auVar179._8_4_)
            ;
            bVar15 = (bool)((byte)(uVar87 >> 3) & 1);
            auVar131._12_4_ =
                 (float)((uint)bVar15 * auVar115._12_4_ | (uint)!bVar15 * auVar179._12_4_);
            fVar170 = (float)((uint)((byte)(uVar87 >> 4) & 1) * auVar115._16_4_);
            auVar131._16_4_ = fVar170;
            fVar144 = (float)((uint)((byte)(uVar87 >> 5) & 1) * auVar115._20_4_);
            auVar131._20_4_ = fVar144;
            fVar165 = (float)((uint)((byte)(uVar87 >> 6) & 1) * auVar115._24_4_);
            auVar131._24_4_ = fVar165;
            iVar1 = (uint)(byte)(uVar87 >> 7) * auVar115._28_4_;
            auVar131._28_4_ = iVar1;
            auVar102 = vblendmps_avx512vl(ZEXT1632(auVar152),auVar106);
            auVar132._0_4_ =
                 (uint)(bVar80 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar80 & 1) * auVar92._0_4_;
            bVar15 = (bool)((byte)(uVar87 >> 1) & 1);
            auVar132._4_4_ = (uint)bVar15 * auVar102._4_4_ | (uint)!bVar15 * auVar92._4_4_;
            bVar15 = (bool)((byte)(uVar87 >> 2) & 1);
            auVar132._8_4_ = (uint)bVar15 * auVar102._8_4_ | (uint)!bVar15 * auVar92._8_4_;
            bVar15 = (bool)((byte)(uVar87 >> 3) & 1);
            auVar132._12_4_ = (uint)bVar15 * auVar102._12_4_ | (uint)!bVar15 * auVar92._12_4_;
            auVar132._16_4_ = (uint)((byte)(uVar87 >> 4) & 1) * auVar102._16_4_;
            auVar132._20_4_ = (uint)((byte)(uVar87 >> 5) & 1) * auVar102._20_4_;
            auVar132._24_4_ = (uint)((byte)(uVar87 >> 6) & 1) * auVar102._24_4_;
            auVar132._28_4_ = (uint)(byte)(uVar87 >> 7) * auVar102._28_4_;
            auVar102 = vblendmps_avx512vl(ZEXT1632(auVar93),ZEXT1632(auVar195));
            auVar133._0_4_ =
                 (float)((uint)(bVar80 & 1) * auVar102._0_4_ |
                        (uint)!(bool)(bVar80 & 1) * auVar196._0_4_);
            bVar15 = (bool)((byte)(uVar87 >> 1) & 1);
            auVar133._4_4_ = (float)((uint)bVar15 * auVar102._4_4_ | (uint)!bVar15 * auVar196._4_4_)
            ;
            bVar15 = (bool)((byte)(uVar87 >> 2) & 1);
            auVar133._8_4_ = (float)((uint)bVar15 * auVar102._8_4_ | (uint)!bVar15 * auVar196._8_4_)
            ;
            bVar15 = (bool)((byte)(uVar87 >> 3) & 1);
            auVar133._12_4_ =
                 (float)((uint)bVar15 * auVar102._12_4_ | (uint)!bVar15 * auVar196._12_4_);
            fVar164 = (float)((uint)((byte)(uVar87 >> 4) & 1) * auVar102._16_4_);
            auVar133._16_4_ = fVar164;
            fVar155 = (float)((uint)((byte)(uVar87 >> 5) & 1) * auVar102._20_4_);
            auVar133._20_4_ = fVar155;
            fVar171 = (float)((uint)((byte)(uVar87 >> 6) & 1) * auVar102._24_4_);
            auVar133._24_4_ = fVar171;
            auVar133._28_4_ = (uint)(byte)(uVar87 >> 7) * auVar102._28_4_;
            auVar102 = vblendmps_avx512vl(ZEXT1632(auVar94),ZEXT1632(auVar90));
            auVar134._0_4_ =
                 (float)((uint)(bVar80 & 1) * auVar102._0_4_ |
                        (uint)!(bool)(bVar80 & 1) * auVar8._0_4_);
            bVar15 = (bool)((byte)(uVar87 >> 1) & 1);
            auVar134._4_4_ = (float)((uint)bVar15 * auVar102._4_4_ | (uint)!bVar15 * auVar8._4_4_);
            bVar15 = (bool)((byte)(uVar87 >> 2) & 1);
            auVar134._8_4_ = (float)((uint)bVar15 * auVar102._8_4_ | (uint)!bVar15 * auVar8._8_4_);
            bVar15 = (bool)((byte)(uVar87 >> 3) & 1);
            auVar134._12_4_ =
                 (float)((uint)bVar15 * auVar102._12_4_ | (uint)!bVar15 * auVar8._12_4_);
            fVar154 = (float)((uint)((byte)(uVar87 >> 4) & 1) * auVar102._16_4_);
            auVar134._16_4_ = fVar154;
            fVar88 = (float)((uint)((byte)(uVar87 >> 5) & 1) * auVar102._20_4_);
            auVar134._20_4_ = fVar88;
            fVar89 = (float)((uint)((byte)(uVar87 >> 6) & 1) * auVar102._24_4_);
            auVar134._24_4_ = fVar89;
            iVar2 = (uint)(byte)(uVar87 >> 7) * auVar102._28_4_;
            auVar134._28_4_ = iVar2;
            auVar135._0_4_ =
                 (uint)(bVar80 & 1) * (int)auVar152._0_4_ |
                 (uint)!(bool)(bVar80 & 1) * auVar106._0_4_;
            bVar15 = (bool)((byte)(uVar87 >> 1) & 1);
            auVar135._4_4_ = (uint)bVar15 * (int)auVar152._4_4_ | (uint)!bVar15 * auVar106._4_4_;
            bVar15 = (bool)((byte)(uVar87 >> 2) & 1);
            auVar135._8_4_ = (uint)bVar15 * (int)auVar152._8_4_ | (uint)!bVar15 * auVar106._8_4_;
            bVar15 = (bool)((byte)(uVar87 >> 3) & 1);
            auVar135._12_4_ = (uint)bVar15 * (int)auVar152._12_4_ | (uint)!bVar15 * auVar106._12_4_;
            auVar135._16_4_ = (uint)!(bool)((byte)(uVar87 >> 4) & 1) * auVar106._16_4_;
            auVar135._20_4_ = (uint)!(bool)((byte)(uVar87 >> 5) & 1) * auVar106._20_4_;
            auVar135._24_4_ = (uint)!(bool)((byte)(uVar87 >> 6) & 1) * auVar106._24_4_;
            auVar135._28_4_ = (uint)!SUB81(uVar87 >> 7,0) * auVar106._28_4_;
            bVar15 = (bool)((byte)(uVar87 >> 1) & 1);
            bVar17 = (bool)((byte)(uVar87 >> 2) & 1);
            bVar19 = (bool)((byte)(uVar87 >> 3) & 1);
            bVar16 = (bool)((byte)(uVar87 >> 1) & 1);
            bVar18 = (bool)((byte)(uVar87 >> 2) & 1);
            bVar20 = (bool)((byte)(uVar87 >> 3) & 1);
            auVar106 = vsubps_avx512vl(auVar135,auVar113);
            auVar116 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar19 * (int)auVar93._12_4_ |
                                                     (uint)!bVar19 * auVar195._12_4_,
                                                     CONCAT48((uint)bVar17 * (int)auVar93._8_4_ |
                                                              (uint)!bVar17 * auVar195._8_4_,
                                                              CONCAT44((uint)bVar15 *
                                                                       (int)auVar93._4_4_ |
                                                                       (uint)!bVar15 *
                                                                       auVar195._4_4_,
                                                                       (uint)(bVar80 & 1) *
                                                                       (int)auVar93._0_4_ |
                                                                       (uint)!(bool)(bVar80 & 1) *
                                                                       auVar195._0_4_)))),auVar99);
            auVar115 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar20 * (int)auVar94._12_4_ |
                                                     (uint)!bVar20 * auVar90._12_4_,
                                                     CONCAT48((uint)bVar18 * (int)auVar94._8_4_ |
                                                              (uint)!bVar18 * auVar90._8_4_,
                                                              CONCAT44((uint)bVar16 *
                                                                       (int)auVar94._4_4_ |
                                                                       (uint)!bVar16 * auVar90._4_4_
                                                                       ,(uint)(bVar80 & 1) *
                                                                        (int)auVar94._0_4_ |
                                                                        (uint)!(bool)(bVar80 & 1) *
                                                                        auVar90._0_4_)))),auVar131);
            auVar114 = vsubps_avx(auVar113,auVar132);
            auVar104 = vsubps_avx(auVar99,auVar133);
            auVar105 = vsubps_avx(auVar131,auVar134);
            auVar63._4_4_ = auVar115._4_4_ * fVar138;
            auVar63._0_4_ = auVar115._0_4_ * fVar136;
            auVar63._8_4_ = auVar115._8_4_ * fVar141;
            auVar63._12_4_ = auVar115._12_4_ * fVar142;
            auVar63._16_4_ = auVar115._16_4_ * 0.0;
            auVar63._20_4_ = auVar115._20_4_ * 0.0;
            auVar63._24_4_ = auVar115._24_4_ * 0.0;
            auVar63._28_4_ = 0;
            auVar92 = vfmsub231ps_fma(auVar63,auVar131,auVar106);
            auVar163._0_4_ = fVar137 * auVar106._0_4_;
            auVar163._4_4_ = fVar140 * auVar106._4_4_;
            auVar163._8_4_ = fVar139 * auVar106._8_4_;
            auVar163._12_4_ = fVar143 * auVar106._12_4_;
            auVar163._16_4_ = auVar106._16_4_ * 0.0;
            auVar163._20_4_ = auVar106._20_4_ * 0.0;
            auVar163._24_4_ = auVar106._24_4_ * 0.0;
            auVar163._28_4_ = 0;
            auVar196 = vfmsub231ps_fma(auVar163,auVar113,auVar116);
            auVar102 = vfmadd231ps_avx512vl(ZEXT1632(auVar196),auVar109,ZEXT1632(auVar92));
            auVar168._0_4_ = auVar116._0_4_ * auVar131._0_4_;
            auVar168._4_4_ = auVar116._4_4_ * auVar131._4_4_;
            auVar168._8_4_ = auVar116._8_4_ * auVar131._8_4_;
            auVar168._12_4_ = auVar116._12_4_ * auVar131._12_4_;
            auVar168._16_4_ = auVar116._16_4_ * fVar170;
            auVar168._20_4_ = auVar116._20_4_ * fVar144;
            auVar168._24_4_ = auVar116._24_4_ * fVar165;
            auVar168._28_4_ = 0;
            auVar92 = vfmsub231ps_fma(auVar168,auVar99,auVar115);
            auVar100 = vfmadd231ps_avx512vl(auVar102,auVar109,ZEXT1632(auVar92));
            auVar102 = vmulps_avx512vl(auVar105,auVar132);
            auVar102 = vfmsub231ps_avx512vl(auVar102,auVar114,auVar134);
            auVar64._4_4_ = auVar104._4_4_ * auVar134._4_4_;
            auVar64._0_4_ = auVar104._0_4_ * auVar134._0_4_;
            auVar64._8_4_ = auVar104._8_4_ * auVar134._8_4_;
            auVar64._12_4_ = auVar104._12_4_ * auVar134._12_4_;
            auVar64._16_4_ = auVar104._16_4_ * fVar154;
            auVar64._20_4_ = auVar104._20_4_ * fVar88;
            auVar64._24_4_ = auVar104._24_4_ * fVar89;
            auVar64._28_4_ = iVar2;
            auVar92 = vfmsub231ps_fma(auVar64,auVar133,auVar105);
            auVar169._0_4_ = auVar133._0_4_ * auVar114._0_4_;
            auVar169._4_4_ = auVar133._4_4_ * auVar114._4_4_;
            auVar169._8_4_ = auVar133._8_4_ * auVar114._8_4_;
            auVar169._12_4_ = auVar133._12_4_ * auVar114._12_4_;
            auVar169._16_4_ = fVar164 * auVar114._16_4_;
            auVar169._20_4_ = fVar155 * auVar114._20_4_;
            auVar169._24_4_ = fVar171 * auVar114._24_4_;
            auVar169._28_4_ = 0;
            auVar196 = vfmsub231ps_fma(auVar169,auVar104,auVar132);
            auVar102 = vfmadd231ps_avx512vl(ZEXT1632(auVar196),auVar109,auVar102);
            auVar107 = vfmadd231ps_avx512vl(auVar102,auVar109,ZEXT1632(auVar92));
            auVar102 = vmaxps_avx(auVar100,auVar107);
            uVar146 = vcmpps_avx512vl(auVar102,auVar109,2);
            local_310 = local_310 & (byte)uVar146;
            auVar187 = ZEXT3264(auVar177);
            if (local_310 == 0) {
LAB_01dc3378:
              local_310 = 0;
            }
            else {
              auVar65._4_4_ = auVar105._4_4_ * auVar116._4_4_;
              auVar65._0_4_ = auVar105._0_4_ * auVar116._0_4_;
              auVar65._8_4_ = auVar105._8_4_ * auVar116._8_4_;
              auVar65._12_4_ = auVar105._12_4_ * auVar116._12_4_;
              auVar65._16_4_ = auVar105._16_4_ * auVar116._16_4_;
              auVar65._20_4_ = auVar105._20_4_ * auVar116._20_4_;
              auVar65._24_4_ = auVar105._24_4_ * auVar116._24_4_;
              auVar65._28_4_ = auVar102._28_4_;
              auVar8 = vfmsub231ps_fma(auVar65,auVar104,auVar115);
              auVar66._4_4_ = auVar115._4_4_ * auVar114._4_4_;
              auVar66._0_4_ = auVar115._0_4_ * auVar114._0_4_;
              auVar66._8_4_ = auVar115._8_4_ * auVar114._8_4_;
              auVar66._12_4_ = auVar115._12_4_ * auVar114._12_4_;
              auVar66._16_4_ = auVar115._16_4_ * auVar114._16_4_;
              auVar66._20_4_ = auVar115._20_4_ * auVar114._20_4_;
              auVar66._24_4_ = auVar115._24_4_ * auVar114._24_4_;
              auVar66._28_4_ = auVar115._28_4_;
              auVar196 = vfmsub231ps_fma(auVar66,auVar106,auVar105);
              auVar67._4_4_ = auVar104._4_4_ * auVar106._4_4_;
              auVar67._0_4_ = auVar104._0_4_ * auVar106._0_4_;
              auVar67._8_4_ = auVar104._8_4_ * auVar106._8_4_;
              auVar67._12_4_ = auVar104._12_4_ * auVar106._12_4_;
              auVar67._16_4_ = auVar104._16_4_ * auVar106._16_4_;
              auVar67._20_4_ = auVar104._20_4_ * auVar106._20_4_;
              auVar67._24_4_ = auVar104._24_4_ * auVar106._24_4_;
              auVar67._28_4_ = auVar104._28_4_;
              auVar195 = vfmsub231ps_fma(auVar67,auVar114,auVar116);
              auVar92 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar196),ZEXT1632(auVar195));
              auVar102 = vfmadd231ps_avx512vl(ZEXT1632(auVar92),ZEXT1632(auVar8),auVar109);
              auVar116 = vrcp14ps_avx512vl(auVar102);
              auVar29._8_4_ = 0x3f800000;
              auVar29._0_8_ = &DAT_3f8000003f800000;
              auVar29._12_4_ = 0x3f800000;
              auVar29._16_4_ = 0x3f800000;
              auVar29._20_4_ = 0x3f800000;
              auVar29._24_4_ = 0x3f800000;
              auVar29._28_4_ = 0x3f800000;
              auVar115 = vfnmadd213ps_avx512vl(auVar116,auVar102,auVar29);
              auVar92 = vfmadd132ps_fma(auVar115,auVar116,auVar116);
              auVar68._4_4_ = auVar195._4_4_ * auVar131._4_4_;
              auVar68._0_4_ = auVar195._0_4_ * auVar131._0_4_;
              auVar68._8_4_ = auVar195._8_4_ * auVar131._8_4_;
              auVar68._12_4_ = auVar195._12_4_ * auVar131._12_4_;
              auVar68._16_4_ = fVar170 * 0.0;
              auVar68._20_4_ = fVar144 * 0.0;
              auVar68._24_4_ = fVar165 * 0.0;
              auVar68._28_4_ = iVar1;
              auVar196 = vfmadd231ps_fma(auVar68,auVar99,ZEXT1632(auVar196));
              auVar196 = vfmadd231ps_fma(ZEXT1632(auVar196),auVar113,ZEXT1632(auVar8));
              fVar165 = auVar92._0_4_;
              fVar144 = auVar92._4_4_;
              fVar170 = auVar92._8_4_;
              fVar171 = auVar92._12_4_;
              auVar116 = ZEXT1632(CONCAT412(auVar196._12_4_ * fVar171,
                                            CONCAT48(auVar196._8_4_ * fVar170,
                                                     CONCAT44(auVar196._4_4_ * fVar144,
                                                              auVar196._0_4_ * fVar165))));
              auVar77._4_4_ = uStack_27c;
              auVar77._0_4_ = local_280;
              auVar77._8_4_ = uStack_278;
              auVar77._12_4_ = uStack_274;
              auVar77._16_4_ = uStack_270;
              auVar77._20_4_ = uStack_26c;
              auVar77._24_4_ = uStack_268;
              auVar77._28_4_ = uStack_264;
              uVar146 = vcmpps_avx512vl(auVar116,auVar77,0xd);
              uVar145 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar30._4_4_ = uVar145;
              auVar30._0_4_ = uVar145;
              auVar30._8_4_ = uVar145;
              auVar30._12_4_ = uVar145;
              auVar30._16_4_ = uVar145;
              auVar30._20_4_ = uVar145;
              auVar30._24_4_ = uVar145;
              auVar30._28_4_ = uVar145;
              uVar23 = vcmpps_avx512vl(auVar116,auVar30,2);
              local_310 = (byte)uVar146 & (byte)uVar23 & local_310;
              if (local_310 == 0) goto LAB_01dc3378;
              uVar146 = vcmpps_avx512vl(auVar102,auVar109,4);
              if ((local_310 & (byte)uVar146) == 0) {
                local_310 = 0;
              }
              else {
                local_310 = local_310 & (byte)uVar146;
                fVar155 = auVar100._0_4_ * fVar165;
                fVar164 = auVar100._4_4_ * fVar144;
                auVar69._4_4_ = fVar164;
                auVar69._0_4_ = fVar155;
                fVar88 = auVar100._8_4_ * fVar170;
                auVar69._8_4_ = fVar88;
                fVar89 = auVar100._12_4_ * fVar171;
                auVar69._12_4_ = fVar89;
                fVar154 = auVar100._16_4_ * 0.0;
                auVar69._16_4_ = fVar154;
                fVar136 = auVar100._20_4_ * 0.0;
                auVar69._20_4_ = fVar136;
                fVar137 = auVar100._24_4_ * 0.0;
                auVar69._24_4_ = fVar137;
                auVar69._28_4_ = auVar100._28_4_;
                fVar165 = auVar107._0_4_ * fVar165;
                fVar144 = auVar107._4_4_ * fVar144;
                auVar70._4_4_ = fVar144;
                auVar70._0_4_ = fVar165;
                fVar170 = auVar107._8_4_ * fVar170;
                auVar70._8_4_ = fVar170;
                fVar171 = auVar107._12_4_ * fVar171;
                auVar70._12_4_ = fVar171;
                fVar138 = auVar107._16_4_ * 0.0;
                auVar70._16_4_ = fVar138;
                fVar140 = auVar107._20_4_ * 0.0;
                auVar70._20_4_ = fVar140;
                fVar141 = auVar107._24_4_ * 0.0;
                auVar70._24_4_ = fVar141;
                auVar70._28_4_ = auVar107._28_4_;
                auVar174._8_4_ = 0x3f800000;
                auVar174._0_8_ = &DAT_3f8000003f800000;
                auVar174._12_4_ = 0x3f800000;
                auVar174._16_4_ = 0x3f800000;
                auVar174._20_4_ = 0x3f800000;
                auVar174._24_4_ = 0x3f800000;
                auVar174._28_4_ = 0x3f800000;
                auVar102 = vsubps_avx512vl(auVar174,auVar69);
                bVar15 = (bool)((byte)(uVar87 >> 1) & 1);
                bVar16 = (bool)((byte)(uVar87 >> 2) & 1);
                bVar17 = (bool)((byte)(uVar87 >> 3) & 1);
                bVar18 = (bool)((byte)(uVar87 >> 4) & 1);
                bVar19 = (bool)((byte)(uVar87 >> 5) & 1);
                bVar20 = (bool)((byte)(uVar87 >> 6) & 1);
                bVar21 = SUB81(uVar87 >> 7,0);
                in_ZMM20 = ZEXT3264(CONCAT428((uint)bVar21 * auVar100._28_4_ |
                                              (uint)!bVar21 * auVar102._28_4_,
                                              CONCAT424((uint)bVar20 * (int)fVar137 |
                                                        (uint)!bVar20 * auVar102._24_4_,
                                                        CONCAT420((uint)bVar19 * (int)fVar136 |
                                                                  (uint)!bVar19 * auVar102._20_4_,
                                                                  CONCAT416((uint)bVar18 *
                                                                            (int)fVar154 |
                                                                            (uint)!bVar18 *
                                                                            auVar102._16_4_,
                                                                            CONCAT412((uint)bVar17 *
                                                                                      (int)fVar89 |
                                                                                      (uint)!bVar17
                                                                                      * auVar102.
                                                  _12_4_,CONCAT48((uint)bVar16 * (int)fVar88 |
                                                                  (uint)!bVar16 * auVar102._8_4_,
                                                                  CONCAT44((uint)bVar15 *
                                                                           (int)fVar164 |
                                                                           (uint)!bVar15 *
                                                                           auVar102._4_4_,
                                                                           (uint)(bVar80 & 1) *
                                                                           (int)fVar155 |
                                                                           (uint)!(bool)(bVar80 & 1)
                                                                           * auVar102._0_4_))))))));
                auVar102 = vsubps_avx(auVar174,auVar70);
                bVar15 = (bool)((byte)(uVar87 >> 1) & 1);
                bVar16 = (bool)((byte)(uVar87 >> 2) & 1);
                bVar17 = (bool)((byte)(uVar87 >> 3) & 1);
                bVar18 = (bool)((byte)(uVar87 >> 4) & 1);
                bVar19 = (bool)((byte)(uVar87 >> 5) & 1);
                bVar20 = (bool)((byte)(uVar87 >> 6) & 1);
                bVar21 = SUB81(uVar87 >> 7,0);
                local_260._4_4_ = (uint)bVar15 * (int)fVar144 | (uint)!bVar15 * auVar102._4_4_;
                local_260._0_4_ =
                     (uint)(bVar80 & 1) * (int)fVar165 | (uint)!(bool)(bVar80 & 1) * auVar102._0_4_;
                local_260._8_4_ = (uint)bVar16 * (int)fVar170 | (uint)!bVar16 * auVar102._8_4_;
                local_260._12_4_ = (uint)bVar17 * (int)fVar171 | (uint)!bVar17 * auVar102._12_4_;
                local_260._16_4_ = (uint)bVar18 * (int)fVar138 | (uint)!bVar18 * auVar102._16_4_;
                local_260._20_4_ = (uint)bVar19 * (int)fVar140 | (uint)!bVar19 * auVar102._20_4_;
                local_260._24_4_ = (uint)bVar20 * (int)fVar141 | (uint)!bVar20 * auVar102._24_4_;
                local_260._28_4_ = (uint)bVar21 * auVar107._28_4_ | (uint)!bVar21 * auVar102._28_4_;
                auVar193 = ZEXT3264(auVar116);
              }
            }
            auVar191 = ZEXT3264(local_5a0);
            if (local_310 != 0) {
              auVar102 = vsubps_avx(ZEXT1632(auVar91),auVar97);
              local_520 = in_ZMM20._0_32_;
              auVar102 = vfmadd213ps_avx512vl(auVar102,local_520,auVar97);
              auVar150._0_4_ = auVar102._0_4_ + auVar102._0_4_;
              auVar150._4_4_ = auVar102._4_4_ + auVar102._4_4_;
              auVar150._8_4_ = auVar102._8_4_ + auVar102._8_4_;
              auVar150._12_4_ = auVar102._12_4_ + auVar102._12_4_;
              auVar150._16_4_ = auVar102._16_4_ + auVar102._16_4_;
              auVar150._20_4_ = auVar102._20_4_ + auVar102._20_4_;
              auVar150._24_4_ = auVar102._24_4_ + auVar102._24_4_;
              auVar150._28_4_ = auVar102._28_4_ + auVar102._28_4_;
              uVar145 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x10);
              auVar31._4_4_ = uVar145;
              auVar31._0_4_ = uVar145;
              auVar31._8_4_ = uVar145;
              auVar31._12_4_ = uVar145;
              auVar31._16_4_ = uVar145;
              auVar31._20_4_ = uVar145;
              auVar31._24_4_ = uVar145;
              auVar31._28_4_ = uVar145;
              auVar102 = vmulps_avx512vl(auVar150,auVar31);
              local_540 = auVar193._0_32_;
              uVar146 = vcmpps_avx512vl(local_540,auVar102,6);
              local_310 = local_310 & (byte)uVar146;
              if (local_310 != 0) {
                auVar151._8_4_ = 0xbf800000;
                auVar151._0_8_ = 0xbf800000bf800000;
                auVar151._12_4_ = 0xbf800000;
                auVar151._16_4_ = 0xbf800000;
                auVar151._20_4_ = 0xbf800000;
                auVar151._24_4_ = 0xbf800000;
                auVar151._28_4_ = 0xbf800000;
                auVar32._8_4_ = 0x40000000;
                auVar32._0_8_ = 0x4000000040000000;
                auVar32._12_4_ = 0x40000000;
                auVar32._16_4_ = 0x40000000;
                auVar32._20_4_ = 0x40000000;
                auVar32._24_4_ = 0x40000000;
                auVar32._28_4_ = 0x40000000;
                local_3a0 = vfmadd132ps_avx512vl(local_260,auVar151,auVar32);
                local_260 = local_3a0;
                auVar102 = local_260;
                local_360 = (undefined4)lVar86;
                local_340 = local_5b0;
                uStack_338 = uStack_5a8;
                local_330 = local_5c0;
                uStack_328 = uStack_5b8;
                local_320 = local_580;
                uStack_318 = uStack_578;
                pGVar13 = (context->scene->geometries).items[local_668].ptr;
                if ((pGVar13->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  bVar80 = 0;
                }
                else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                        (bVar80 = 1, pGVar13->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  auVar116 = vaddps_avx512vl(local_520,_DAT_02020f40);
                  auVar92 = vcvtsi2ss_avx512f(auVar192._0_16_,local_360);
                  fVar165 = auVar92._0_4_;
                  local_300[0] = (fVar165 + auVar116._0_4_) * (float)local_2a0._0_4_;
                  local_300[1] = (fVar165 + auVar116._4_4_) * (float)local_2a0._4_4_;
                  local_300[2] = (fVar165 + auVar116._8_4_) * fStack_298;
                  local_300[3] = (fVar165 + auVar116._12_4_) * fStack_294;
                  fStack_2f0 = (fVar165 + auVar116._16_4_) * fStack_290;
                  fStack_2ec = (fVar165 + auVar116._20_4_) * fStack_28c;
                  fStack_2e8 = (fVar165 + auVar116._24_4_) * fStack_288;
                  fStack_2e4 = fVar165 + auVar116._28_4_;
                  local_260._0_8_ = local_3a0._0_8_;
                  local_260._8_8_ = local_3a0._8_8_;
                  local_260._16_8_ = local_3a0._16_8_;
                  local_260._24_8_ = local_3a0._24_8_;
                  local_2e0 = local_260._0_8_;
                  uStack_2d8 = local_260._8_8_;
                  uStack_2d0 = local_260._16_8_;
                  uStack_2c8 = local_260._24_8_;
                  local_2c0 = local_540;
                  local_630._8_8_ = uStack_5a8;
                  local_630._0_8_ = local_5b0;
                  uVar87 = 0;
                  uVar81 = (ulong)local_310;
                  for (uVar83 = uVar81; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x8000000000000000
                      ) {
                    uVar87 = uVar87 + 1;
                  }
                  local_210 = local_5c0;
                  uStack_208 = uStack_5b8;
                  local_220 = local_580;
                  uStack_218 = uStack_578;
                  local_620 = CONCAT44(local_620._4_4_,1);
                  local_3c0 = local_520;
                  local_380 = local_540;
                  local_35c = iVar12;
                  local_350 = auVar22;
                  local_260 = auVar102;
                  do {
                    local_610 = *(undefined4 *)(ray + k * 4 + 0x80);
                    fVar165 = local_300[uVar87];
                    local_420._4_4_ = fVar165;
                    local_420._0_4_ = fVar165;
                    local_420._8_4_ = fVar165;
                    local_420._12_4_ = fVar165;
                    local_410 = *(undefined4 *)((long)&local_2e0 + uVar87 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2c0 + uVar87 * 4);
                    local_660.context = context->user;
                    fVar144 = 1.0 - fVar165;
                    auVar8 = vfnmadd231ss_fma(ZEXT416((uint)(fVar165 * (fVar144 + fVar144))),
                                              ZEXT416((uint)fVar144),ZEXT416((uint)fVar144));
                    auVar92 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_420,
                                              ZEXT416(0xc0a00000));
                    auVar91 = vfmadd231ss_fma(ZEXT416((uint)(fVar165 * fVar165 * 3.0)),
                                              ZEXT416((uint)(fVar165 + fVar165)),auVar92);
                    auVar92 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_420,
                                              ZEXT416(0x40000000));
                    auVar92 = vfmadd231ss_fma(ZEXT416((uint)(fVar144 * fVar144 * -3.0)),
                                              ZEXT416((uint)(fVar144 + fVar144)),auVar92);
                    auVar196 = vfmadd231ss_fma(ZEXT416((uint)(fVar165 * fVar165)),local_420,
                                               ZEXT416((uint)(fVar144 * -2.0)));
                    fVar165 = auVar8._0_4_ * 0.5;
                    fVar144 = auVar91._0_4_ * 0.5;
                    fVar170 = auVar92._0_4_ * 0.5;
                    fVar171 = auVar196._0_4_ * 0.5;
                    auVar159._0_4_ = fVar171 * (float)local_220;
                    auVar159._4_4_ = fVar171 * local_220._4_4_;
                    auVar159._8_4_ = fVar171 * (float)uStack_218;
                    auVar159._12_4_ = fVar171 * uStack_218._4_4_;
                    auVar173._4_4_ = fVar170;
                    auVar173._0_4_ = fVar170;
                    auVar173._8_4_ = fVar170;
                    auVar173._12_4_ = fVar170;
                    auVar78._8_8_ = uStack_208;
                    auVar78._0_8_ = local_210;
                    auVar92 = vfmadd132ps_fma(auVar173,auVar159,auVar78);
                    auVar160._4_4_ = fVar144;
                    auVar160._0_4_ = fVar144;
                    auVar160._8_4_ = fVar144;
                    auVar160._12_4_ = fVar144;
                    auVar92 = vfmadd132ps_fma(auVar160,auVar92,local_630);
                    auVar148._4_4_ = fVar165;
                    auVar148._0_4_ = fVar165;
                    auVar148._8_4_ = fVar165;
                    auVar148._12_4_ = fVar165;
                    auVar92 = vfmadd213ps_fma(auVar148,auVar22,auVar92);
                    local_450 = auVar92._0_4_;
                    local_440 = vshufps_avx(auVar92,auVar92,0x55);
                    local_430 = vshufps_avx(auVar92,auVar92,0xaa);
                    local_400 = local_5e0._0_8_;
                    uStack_3f8 = local_5e0._8_8_;
                    local_3f0 = local_5d0;
                    vpcmpeqd_avx2(ZEXT1632(local_5d0),ZEXT1632(local_5d0));
                    uStack_3dc = (local_660.context)->instID[0];
                    local_3e0 = uStack_3dc;
                    uStack_3d8 = uStack_3dc;
                    uStack_3d4 = uStack_3dc;
                    uStack_3d0 = (local_660.context)->instPrimID[0];
                    uStack_3cc = uStack_3d0;
                    uStack_3c8 = uStack_3d0;
                    uStack_3c4 = uStack_3d0;
                    local_680 = local_490._0_8_;
                    uStack_678 = local_490._8_8_;
                    local_660.valid = (int *)&local_680;
                    local_660.geometryUserPtr = pGVar13->userPtr;
                    local_660.hit = (RTCHitN *)&local_450;
                    local_660.N = 4;
                    pRVar79 = (RayK<4> *)pGVar13->occlusionFilterN;
                    local_5f0._0_8_ = uVar81;
                    local_600._0_8_ = uVar87;
                    uVar83 = uVar87;
                    local_660.ray = (RTCRayN *)ray;
                    uStack_44c = local_450;
                    uStack_448 = local_450;
                    uStack_444 = local_450;
                    uStack_40c = local_410;
                    uStack_408 = local_410;
                    uStack_404 = local_410;
                    if (pRVar79 != (RayK<4> *)0x0) {
                      pRVar79 = (RayK<4> *)(*(code *)pRVar79)(&local_660);
                      uVar81 = local_5f0._0_8_;
                      uVar83 = local_600._0_8_;
                    }
                    auVar73._8_8_ = uStack_678;
                    auVar73._0_8_ = local_680;
                    uVar87 = vptestmd_avx512vl(auVar73,auVar73);
                    if ((uVar87 & 0xf) != 0) {
                      p_Var14 = context->args->filter;
                      if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar13->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var14)(&local_660);
                        uVar81 = local_5f0._0_8_;
                        uVar83 = local_600._0_8_;
                      }
                      auVar196 = auVar197._0_16_;
                      auVar74._8_8_ = uStack_678;
                      auVar74._0_8_ = local_680;
                      auVar92 = *(undefined1 (*) [16])(local_660.ray + 0x80);
                      uVar87 = vptestmd_avx512vl(auVar74,auVar74);
                      uVar87 = uVar87 & 0xf;
                      auVar91 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                      bVar15 = (bool)((byte)uVar87 & 1);
                      auVar96._0_4_ = (uint)bVar15 * auVar91._0_4_ | (uint)!bVar15 * auVar92._0_4_;
                      bVar15 = (bool)((byte)(uVar87 >> 1) & 1);
                      auVar96._4_4_ = (uint)bVar15 * auVar91._4_4_ | (uint)!bVar15 * auVar92._4_4_;
                      bVar15 = (bool)((byte)(uVar87 >> 2) & 1);
                      auVar96._8_4_ = (uint)bVar15 * auVar91._8_4_ | (uint)!bVar15 * auVar92._8_4_;
                      bVar15 = SUB81(uVar87 >> 3,0);
                      auVar96._12_4_ =
                           (uint)bVar15 * auVar91._12_4_ | (uint)!bVar15 * auVar92._12_4_;
                      *(undefined1 (*) [16])(local_660.ray + 0x80) = auVar96;
                      pRVar79 = (RayK<4> *)local_660.ray;
                      if ((byte)uVar87 != 0) break;
                    }
                    auVar196 = auVar197._0_16_;
                    *(undefined4 *)(ray + k * 4 + 0x80) = local_610;
                    uVar87 = 0;
                    uVar81 = uVar81 ^ 1L << (uVar83 & 0x3f);
                    for (uVar83 = uVar81; (uVar83 & 1) == 0;
                        uVar83 = uVar83 >> 1 | 0x8000000000000000) {
                      uVar87 = uVar87 + 1;
                    }
                    local_620 = CONCAT44(local_620._4_4_,
                                         (int)CONCAT71((int7)((ulong)pRVar79 >> 8),uVar81 != 0));
                  } while (uVar81 != 0);
                  bVar80 = (byte)local_620 & 1;
                  auVar92 = vxorps_avx512vl(auVar196,auVar196);
                  auVar197 = ZEXT1664(auVar92);
                  in_ZMM20 = ZEXT3264(local_520);
                  auVar193 = ZEXT3264(local_540);
                  auVar194 = ZEXT3264(local_4c0);
                  auVar187 = ZEXT3264(local_4e0);
                  auVar191 = ZEXT3264(local_5a0);
                }
                bVar82 = (bool)(bVar82 | bVar80);
              }
            }
          }
          auVar175 = ZEXT3264(auVar101);
          auVar153 = ZEXT3264(auVar103);
          local_540 = auVar193._0_32_;
          lVar86 = lVar86 + 8;
          auVar192 = auVar187;
        } while ((int)lVar86 < iVar12);
      }
      if (bVar82 != false) {
        return local_6f9;
      }
      uVar145 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar28._4_4_ = uVar145;
      auVar28._0_4_ = uVar145;
      auVar28._8_4_ = uVar145;
      auVar28._12_4_ = uVar145;
      auVar28._16_4_ = uVar145;
      auVar28._20_4_ = uVar145;
      auVar28._24_4_ = uVar145;
      auVar28._28_4_ = uVar145;
      uVar146 = vcmpps_avx512vl(local_80,auVar28,2);
      uVar84 = (uint)uVar85 & (uint)uVar146;
      uVar85 = (ulong)uVar84;
      local_6f9 = uVar84 != 0;
    } while (local_6f9);
  }
  return local_6f9;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }